

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_all_types.cpp
# Opt level: O2

vector<duckdb::TestType,_true> *
duckdb::TestAllTypesFun::GetTestTypes
          (vector<duckdb::TestType,_true> *__return_storage_ptr__,bool use_large_enum)

{
  shared_ptr<duckdb::ExtraTypeInfo,_true> *psVar1;
  undefined1 auVar2 [16];
  date_t value;
  timestamp_t value_00;
  timestamp_tz_t value_01;
  LogicalType *pLVar3;
  ulong in_RCX;
  Vector *__args_2;
  long lVar4;
  data_ptr_t pdVar5;
  idx_t i;
  unsigned_long uVar6;
  string_t sVar7;
  anon_struct_16_3_d7536bce_for_pointer aVar8;
  interval_t interval;
  string_t data;
  string_t data_00;
  string_t data_01;
  string_t data_02;
  string_t data_03;
  initializer_list<duckdb::Value> __l;
  initializer_list<duckdb::Value> __l_00;
  initializer_list<duckdb::Value> __l_01;
  initializer_list<duckdb::Value> __l_02;
  initializer_list<duckdb::Value> __l_03;
  initializer_list<duckdb::Value> __l_04;
  initializer_list<duckdb::Value> __l_05;
  initializer_list<duckdb::Value> __l_06;
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>
  __l_07;
  initializer_list<duckdb::Value> __l_08;
  initializer_list<duckdb::Value> __l_09;
  initializer_list<duckdb::Value> __l_10;
  initializer_list<duckdb::Value> __l_11;
  initializer_list<duckdb::Value> __l_12;
  initializer_list<duckdb::Value> __l_13;
  initializer_list<duckdb::Value> __l_14;
  initializer_list<duckdb::Value> __l_15;
  initializer_list<duckdb::Value> __l_16;
  initializer_list<duckdb::Value> __l_17;
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>
  __l_18;
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>
  __l_19;
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>
  __l_20;
  initializer_list<duckdb::Value> __l_21;
  initializer_list<duckdb::Value> __l_22;
  initializer_list<duckdb::Value> __l_23;
  initializer_list<duckdb::Value> __l_24;
  Value max_map_value;
  allocator_type local_1729;
  Vector large_enum;
  Value local_16a8;
  Value local_1668;
  Value local_1628;
  Value local_15e8;
  LogicalType int_list_type;
  LogicalType fixed_int_array_type;
  LogicalType struct_type;
  child_list_t<Value> max_struct_vl_list;
  child_list_t<Value> min_struct_vl_list;
  child_list_t<Value> max_struct_list;
  child_list_t<Value> min_struct_list;
  LogicalType fixed_varchar_array_type;
  Value int_list;
  Value empty_int_list;
  Value local_1448;
  vector<duckdb::Value,_true> map_values;
  child_list_t<Value> map_struct2;
  child_list_t<Value> map_struct1;
  child_list_t<LogicalType> struct_list_type_list;
  child_list_t<LogicalType> struct_type_list;
  child_list_t<LogicalType> members;
  LogicalType map_type;
  Value max_struct_val;
  Value min_struct_val;
  LogicalType varchar_list_type;
  Vector small_enum;
  Value fixed_int_max_array_value;
  Value fixed_varchar_min_array_value;
  Value fixed_varchar_max_array_value;
  Value min_struct_val_list;
  anon_union_16_2_67f50693_for_value local_1140;
  anon_union_16_2_67f50693_for_value local_1130;
  anon_union_16_2_67f50693_for_value local_1120;
  anon_union_16_2_67f50693_for_value local_1110;
  anon_union_16_2_67f50693_for_value local_1100;
  anon_union_16_2_67f50693_for_value local_10f0;
  Value fixed_int_min_array_value;
  vector<duckdb::Value,_true> local_10a0;
  vector<duckdb::Value,_true> local_1088;
  LogicalType list_of_fixed_array_of_int_type;
  vector<duckdb::Value,_true> local_1058;
  vector<duckdb::Value,_true> local_1040;
  LogicalType fixed_array_of_list_of_int_type;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  local_1010;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  local_ff8;
  child_list_t<LogicalType> local_fe0;
  LogicalType struct_of_fixed_array_type;
  vector<duckdb::Value,_true> local_fb0;
  vector<duckdb::Value,_true> local_f98;
  LogicalType fixed_struct_array_type;
  vector<duckdb::Value,_true> local_f68;
  LogicalType local_f50;
  vector<duckdb::Value,_true> local_f38;
  LogicalType fixed_nested_varchar_array_type;
  vector<duckdb::Value,_true> local_f08;
  LogicalType local_ef0;
  vector<duckdb::Value,_true> local_ed8;
  LogicalType fixed_nested_int_array_type;
  vector<duckdb::Value,_true> local_ea8;
  LogicalType local_e90;
  vector<duckdb::Value,_true> local_e78;
  vector<duckdb::Value,_true> local_e60;
  LogicalType local_e48;
  vector<duckdb::Value,_true> local_e30;
  child_list_t<LogicalType> local_e18;
  child_list_t<LogicalType> local_e00;
  child_list_t<LogicalType> local_de8;
  LogicalType union_type;
  vector<duckdb::Value,_true> local_db8;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  local_da0;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  local_d88;
  LogicalType local_d70;
  LogicalType local_d58;
  LogicalType local_d40;
  vector<duckdb::Value,_true> local_d28;
  LogicalType array_of_structs_type;
  LogicalType local_cf8;
  LogicalType local_ce0;
  child_list_t<LogicalType> local_cc8;
  LogicalType struct_list_type;
  LogicalType local_c98;
  LogicalType local_c80;
  child_list_t<LogicalType> local_c68;
  LogicalType local_c50;
  vector<duckdb::Value,_true> local_c38;
  LogicalType nested_list_type;
  LogicalType local_c08;
  vector<duckdb::Value,_true> local_bf0;
  LogicalType local_bd8;
  vector<duckdb::Value,_true> local_bc0;
  LogicalType timestamptz_list_type;
  LogicalType local_b90;
  vector<duckdb::Value,_true> local_b78;
  LogicalType timestamp_list_type;
  LogicalType local_b48;
  vector<duckdb::Value,_true> local_b30;
  LogicalType date_list_type;
  LogicalType local_b00;
  vector<duckdb::Value,_true> local_ae8;
  LogicalType double_list_type;
  LogicalType local_ab8;
  LogicalType local_aa0;
  vector<duckdb::Value,_true> local_a88;
  LogicalType local_a70;
  LogicalType local_a58;
  LogicalType local_a40;
  LogicalType local_a28;
  Value fixed_nested_int_min_array_value;
  Value empty_varchar_list;
  Value empty_timestamptz_list;
  Vector medium_enum;
  vector<duckdb::Value,_true> local_8e8;
  vector<duckdb::Value,_true> local_8c8;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  local_8a8;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  local_888;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  local_868;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  local_848;
  vector<duckdb::Value,_true> local_828;
  vector<duckdb::Value,_true> local_808;
  vector<duckdb::Value,_true> local_7e8;
  vector<duckdb::Value,_true> local_7c8;
  vector<duckdb::Value,_true> local_7a8;
  vector<duckdb::Value,_true> local_788;
  vector<duckdb::Value,_true> local_768;
  Value empty_timestamp_list;
  Value empty_double_list;
  string local_6d0;
  Value struct_of_fixed_array_min_value;
  Value fixed_nested_int_max_array_value;
  Value empty_nested_list;
  Value varchar_list;
  Value list_of_fixed_array_of_int_max_value;
  Value list_of_fixed_array_of_int_min_value;
  Value fixed_array_of_list_of_int_max_value;
  Value fixed_array_of_list_of_int_min_value;
  Value struct_of_fixed_array_max_value;
  Value fixed_struct_max_array_value;
  Value fixed_struct_min_array_value;
  Value fixed_nested_varchar_max_array_value;
  Value fixed_nested_varchar_min_array_value;
  Value timestamptz_list;
  Value timestamp_list;
  Value empty_date_list;
  Value local_2b0;
  Value local_270;
  Value local_230;
  Value min_map_value;
  Value max_array_of_struct_val;
  Value min_array_of_struct_val;
  Value max_struct_val_list;
  Value nested_int_list;
  Value date_list;
  Value double_list;
  
  (__return_storage_ptr__->super_vector<duckdb::TestType,_std::allocator<duckdb::TestType>_>).
  super__Vector_base<duckdb::TestType,_std::allocator<duckdb::TestType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super_vector<duckdb::TestType,_std::allocator<duckdb::TestType>_>).
  super__Vector_base<duckdb::TestType,_std::allocator<duckdb::TestType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super_vector<duckdb::TestType,_std::allocator<duckdb::TestType>_>).
  super__Vector_base<duckdb::TestType,_std::allocator<duckdb::TestType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ::std::vector<duckdb::TestType,std::allocator<duckdb::TestType>>::
  emplace_back<duckdb::LogicalTypeId_const&,char_const(&)[5]>
            ((vector<duckdb::TestType,std::allocator<duckdb::TestType>> *)__return_storage_ptr__,
             &LogicalType::BOOLEAN,(char (*) [5])0x1fdedd6);
  ::std::vector<duckdb::TestType,std::allocator<duckdb::TestType>>::
  emplace_back<duckdb::LogicalTypeId_const&,char_const(&)[8]>
            ((vector<duckdb::TestType,std::allocator<duckdb::TestType>> *)__return_storage_ptr__,
             &LogicalType::TINYINT,(char (*) [8])0x1fdadf2);
  ::std::vector<duckdb::TestType,std::allocator<duckdb::TestType>>::
  emplace_back<duckdb::LogicalTypeId_const&,char_const(&)[9]>
            ((vector<duckdb::TestType,std::allocator<duckdb::TestType>> *)__return_storage_ptr__,
             &LogicalType::SMALLINT,(char (*) [9])0x1fdae8d);
  ::std::vector<duckdb::TestType,std::allocator<duckdb::TestType>>::
  emplace_back<duckdb::LogicalTypeId_const&,char_const(&)[4]>
            ((vector<duckdb::TestType,std::allocator<duckdb::TestType>> *)__return_storage_ptr__,
             &LogicalType::INTEGER,(char (*) [4])0x200186e);
  ::std::vector<duckdb::TestType,std::allocator<duckdb::TestType>>::
  emplace_back<duckdb::LogicalTypeId_const&,char_const(&)[7]>
            ((vector<duckdb::TestType,std::allocator<duckdb::TestType>> *)__return_storage_ptr__,
             &LogicalType::BIGINT,(char (*) [7])0x1fdae19);
  ::std::vector<duckdb::TestType,std::allocator<duckdb::TestType>>::
  emplace_back<duckdb::LogicalTypeId_const&,char_const(&)[8]>
            ((vector<duckdb::TestType,std::allocator<duckdb::TestType>> *)__return_storage_ptr__,
             &LogicalType::HUGEINT,(char (*) [8])0x1fdad62);
  ::std::vector<duckdb::TestType,std::allocator<duckdb::TestType>>::
  emplace_back<duckdb::LogicalTypeId_const&,char_const(&)[9]>
            ((vector<duckdb::TestType,std::allocator<duckdb::TestType>> *)__return_storage_ptr__,
             &LogicalType::UHUGEINT,(char (*) [9])0x1fdaedc);
  ::std::vector<duckdb::TestType,std::allocator<duckdb::TestType>>::
  emplace_back<duckdb::LogicalTypeId_const&,char_const(&)[9]>
            ((vector<duckdb::TestType,std::allocator<duckdb::TestType>> *)__return_storage_ptr__,
             &LogicalType::UTINYINT,(char (*) [9])0x1fdadf1);
  ::std::vector<duckdb::TestType,std::allocator<duckdb::TestType>>::
  emplace_back<duckdb::LogicalTypeId_const&,char_const(&)[10]>
            ((vector<duckdb::TestType,std::allocator<duckdb::TestType>> *)__return_storage_ptr__,
             &LogicalType::USMALLINT,(char (*) [10])0x1fdadcc);
  ::std::vector<duckdb::TestType,std::allocator<duckdb::TestType>>::
  emplace_back<duckdb::LogicalTypeId_const&,char_const(&)[5]>
            ((vector<duckdb::TestType,std::allocator<duckdb::TestType>> *)__return_storage_ptr__,
             &LogicalType::UINTEGER,(char (*) [5])"uint");
  ::std::vector<duckdb::TestType,std::allocator<duckdb::TestType>>::
  emplace_back<duckdb::LogicalTypeId_const&,char_const(&)[8]>
            ((vector<duckdb::TestType,std::allocator<duckdb::TestType>> *)__return_storage_ptr__,
             &LogicalType::UBIGINT,(char (*) [8])0x1fdad85);
  ::std::vector<duckdb::TestType,std::allocator<duckdb::TestType>>::
  emplace_back<duckdb::LogicalTypeId_const&,char_const(&)[7]>
            ((vector<duckdb::TestType,std::allocator<duckdb::TestType>> *)__return_storage_ptr__,
             &LogicalType::VARINT,(char (*) [7])"varint");
  ::std::vector<duckdb::TestType,std::allocator<duckdb::TestType>>::
  emplace_back<duckdb::LogicalTypeId_const&,char_const(&)[5]>
            ((vector<duckdb::TestType,std::allocator<duckdb::TestType>> *)__return_storage_ptr__,
             &LogicalType::DATE,(char (*) [5])0x2104086);
  ::std::vector<duckdb::TestType,std::allocator<duckdb::TestType>>::
  emplace_back<duckdb::LogicalTypeId_const&,char_const(&)[5]>
            ((vector<duckdb::TestType,std::allocator<duckdb::TestType>> *)__return_storage_ptr__,
             &LogicalType::TIME,(char (*) [5])0x1fc49ab);
  ::std::vector<duckdb::TestType,std::allocator<duckdb::TestType>>::
  emplace_back<duckdb::LogicalTypeId_const&,char_const(&)[10]>
            ((vector<duckdb::TestType,std::allocator<duckdb::TestType>> *)__return_storage_ptr__,
             &LogicalType::TIMESTAMP,(char (*) [10])0x210391d);
  ::std::vector<duckdb::TestType,std::allocator<duckdb::TestType>>::
  emplace_back<duckdb::LogicalTypeId_const&,char_const(&)[12]>
            ((vector<duckdb::TestType,std::allocator<duckdb::TestType>> *)__return_storage_ptr__,
             &LogicalType::TIMESTAMP_S,(char (*) [12])"timestamp_s");
  ::std::vector<duckdb::TestType,std::allocator<duckdb::TestType>>::
  emplace_back<duckdb::LogicalTypeId_const&,char_const(&)[13]>
            ((vector<duckdb::TestType,std::allocator<duckdb::TestType>> *)__return_storage_ptr__,
             &LogicalType::TIMESTAMP_MS,(char (*) [13])"timestamp_ms");
  ::std::vector<duckdb::TestType,std::allocator<duckdb::TestType>>::
  emplace_back<duckdb::LogicalTypeId_const&,char_const(&)[13]>
            ((vector<duckdb::TestType,std::allocator<duckdb::TestType>> *)__return_storage_ptr__,
             &LogicalType::TIMESTAMP_NS,(char (*) [13])0x2104226);
  ::std::vector<duckdb::TestType,std::allocator<duckdb::TestType>>::
  emplace_back<duckdb::LogicalTypeId_const&,char_const(&)[8]>
            ((vector<duckdb::TestType,std::allocator<duckdb::TestType>> *)__return_storage_ptr__,
             &LogicalType::TIME_TZ,(char (*) [8])"time_tz");
  ::std::vector<duckdb::TestType,std::allocator<duckdb::TestType>>::
  emplace_back<duckdb::LogicalTypeId_const&,char_const(&)[13]>
            ((vector<duckdb::TestType,std::allocator<duckdb::TestType>> *)__return_storage_ptr__,
             &LogicalType::TIMESTAMP_TZ,(char (*) [13])"timestamp_tz");
  ::std::vector<duckdb::TestType,std::allocator<duckdb::TestType>>::
  emplace_back<duckdb::LogicalTypeId_const&,char_const(&)[6]>
            ((vector<duckdb::TestType,std::allocator<duckdb::TestType>> *)__return_storage_ptr__,
             &LogicalType::FLOAT,(char (*) [6])0x20018ce);
  ::std::vector<duckdb::TestType,std::allocator<duckdb::TestType>>::
  emplace_back<duckdb::LogicalTypeId_const&,char_const(&)[7]>
            ((vector<duckdb::TestType,std::allocator<duckdb::TestType>> *)__return_storage_ptr__,
             &LogicalType::DOUBLE,(char (*) [7])0x20fc2fc);
  LogicalType::DECIMAL((LogicalType *)&large_enum,'\x04','\x01');
  ::std::vector<duckdb::TestType,std::allocator<duckdb::TestType>>::
  emplace_back<duckdb::LogicalType,char_const(&)[8]>
            ((vector<duckdb::TestType,std::allocator<duckdb::TestType>> *)__return_storage_ptr__,
             (LogicalType *)&large_enum,(char (*) [8])"dec_4_1");
  LogicalType::~LogicalType((LogicalType *)&large_enum);
  LogicalType::DECIMAL((LogicalType *)&large_enum,'\t','\x04');
  ::std::vector<duckdb::TestType,std::allocator<duckdb::TestType>>::
  emplace_back<duckdb::LogicalType,char_const(&)[8]>
            ((vector<duckdb::TestType,std::allocator<duckdb::TestType>> *)__return_storage_ptr__,
             (LogicalType *)&large_enum,(char (*) [8])"dec_9_4");
  LogicalType::~LogicalType((LogicalType *)&large_enum);
  LogicalType::DECIMAL((LogicalType *)&large_enum,'\x12','\x06');
  ::std::vector<duckdb::TestType,std::allocator<duckdb::TestType>>::
  emplace_back<duckdb::LogicalType,char_const(&)[9]>
            ((vector<duckdb::TestType,std::allocator<duckdb::TestType>> *)__return_storage_ptr__,
             (LogicalType *)&large_enum,(char (*) [9])"dec_18_6");
  LogicalType::~LogicalType((LogicalType *)&large_enum);
  LogicalType::DECIMAL((LogicalType *)&large_enum,'&','\n');
  ::std::vector<duckdb::TestType,std::allocator<duckdb::TestType>>::
  emplace_back<duckdb::LogicalType,char_const(&)[9]>
            ((vector<duckdb::TestType,std::allocator<duckdb::TestType>> *)__return_storage_ptr__,
             (LogicalType *)&large_enum,(char (*) [9])"dec38_10");
  LogicalType::~LogicalType((LogicalType *)&large_enum);
  ::std::vector<duckdb::TestType,std::allocator<duckdb::TestType>>::
  emplace_back<duckdb::LogicalTypeId_const&,char_const(&)[5]>
            ((vector<duckdb::TestType,std::allocator<duckdb::TestType>> *)__return_storage_ptr__,
             &LogicalType::UUID,(char (*) [5])0x1ffe7d7);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = in_RCX;
  Value::INTERVAL((Value *)&large_enum,(Value *)0x0,(interval_t)(auVar2 << 0x40));
  interval.micros = in_RCX;
  interval.months = 999999999;
  interval.days = 0;
  Value::INTERVAL((Value *)&small_enum,(Value *)0x3e7000003e7,interval);
  ::std::vector<duckdb::TestType,std::allocator<duckdb::TestType>>::
  emplace_back<duckdb::LogicalTypeId_const&,char_const(&)[9],duckdb::Value,duckdb::Value>
            ((vector<duckdb::TestType,std::allocator<duckdb::TestType>> *)__return_storage_ptr__,
             &LogicalType::INTERVAL,(char (*) [9])0x1fdfe00,(Value *)&large_enum,
             (Value *)&small_enum);
  Value::~Value((Value *)&small_enum);
  Value::~Value((Value *)&large_enum);
  Value::Value((Value *)&large_enum,anon_var_dwarf_13b5ba0);
  local_6d0._M_dataplus._M_p = (pointer)&local_6d0.field_2;
  local_6d0.field_2._M_allocated_capacity._0_4_ = 0x6f6f67;
  local_6d0.field_2._M_allocated_capacity._4_2_ = 0x6573;
  local_6d0._M_string_length = 6;
  local_6d0.field_2._M_local_buf[6] = '\0';
  Value::Value((Value *)&small_enum,&local_6d0);
  ::std::vector<duckdb::TestType,std::allocator<duckdb::TestType>>::
  emplace_back<duckdb::LogicalTypeId_const&,char_const(&)[8],duckdb::Value,duckdb::Value>
            ((vector<duckdb::TestType,std::allocator<duckdb::TestType>> *)__return_storage_ptr__,
             &LogicalType::VARCHAR,(char (*) [8])0x1fb50ea,(Value *)&large_enum,(Value *)&small_enum
            );
  Value::~Value((Value *)&small_enum);
  ::std::__cxx11::string::~string((string *)&local_6d0);
  Value::~Value((Value *)&large_enum);
  ::std::__cxx11::string::string
            ((string *)&medium_enum,"thisisalongblob\\x00withnullbytes",(allocator *)&empty_int_list
            );
  Value::BLOB((Value *)&large_enum,(string *)&medium_enum);
  ::std::__cxx11::string::string((string *)&max_map_value,"\\x00\\x00\\x00a",(allocator *)&int_list)
  ;
  Value::BLOB((Value *)&small_enum,(string *)&max_map_value);
  ::std::vector<duckdb::TestType,std::allocator<duckdb::TestType>>::
  emplace_back<duckdb::LogicalTypeId_const&,char_const(&)[5],duckdb::Value,duckdb::Value>
            ((vector<duckdb::TestType,std::allocator<duckdb::TestType>> *)__return_storage_ptr__,
             &LogicalType::BLOB,(char (*) [5])0x200caa2,(Value *)&large_enum,(Value *)&small_enum);
  Value::~Value((Value *)&small_enum);
  ::std::__cxx11::string::~string((string *)&max_map_value);
  Value::~Value((Value *)&large_enum);
  ::std::__cxx11::string::~string((string *)&medium_enum);
  ::std::__cxx11::string::string
            ((string *)&medium_enum,"0010001001011100010101011010111",(allocator *)&empty_int_list);
  Value::BIT((Value *)&large_enum,(string *)&medium_enum);
  ::std::__cxx11::string::string((string *)&max_map_value,"10101",(allocator *)&int_list);
  Value::BIT((Value *)&small_enum,(string *)&max_map_value);
  __args_2 = &large_enum;
  ::std::vector<duckdb::TestType,std::allocator<duckdb::TestType>>::
  emplace_back<duckdb::LogicalTypeId_const&,char_const(&)[4],duckdb::Value,duckdb::Value>
            ((vector<duckdb::TestType,std::allocator<duckdb::TestType>> *)__return_storage_ptr__,
             &LogicalType::BIT,(char (*) [4])0x2097266,(Value *)__args_2,(Value *)&small_enum);
  Value::~Value((Value *)&small_enum);
  ::std::__cxx11::string::~string((string *)&max_map_value);
  Value::~Value((Value *)&large_enum);
  ::std::__cxx11::string::~string((string *)&medium_enum);
  LogicalType::LogicalType(&local_a28,VARCHAR);
  Vector::Vector(&small_enum,&local_a28,2);
  LogicalType::~LogicalType(&local_a28);
  string_t::string_t((string_t *)&local_10f0.pointer,"DUCK_DUCK_ENUM");
  sVar7.value.pointer.ptr = (char *)__args_2;
  sVar7.value._0_8_ = local_10f0.pointer.ptr;
  sVar7 = StringVector::AddStringOrBlob
                    ((StringVector *)&small_enum,(Vector *)local_10f0._0_8_,sVar7);
  *(anon_union_16_2_67f50693_for_value *)small_enum.data = sVar7.value;
  string_t::string_t((string_t *)&local_1100.pointer,"GOOSE");
  data.value.pointer.ptr = (char *)__args_2;
  data.value._0_8_ = local_1100.pointer.ptr;
  aVar8 = (anon_struct_16_3_d7536bce_for_pointer)
          StringVector::AddStringOrBlob((StringVector *)&small_enum,local_1100.pointer._0_8_,data);
  ((anon_union_16_2_67f50693_for_value *)(small_enum.data + 0x10))->pointer = aVar8;
  LogicalType::ENUM((LogicalType *)&large_enum,&small_enum,2);
  ::std::vector<duckdb::TestType,std::allocator<duckdb::TestType>>::
  emplace_back<duckdb::LogicalType,char_const(&)[11]>
            ((vector<duckdb::TestType,std::allocator<duckdb::TestType>> *)__return_storage_ptr__,
             (LogicalType *)&large_enum,(char (*) [11])"small_enum");
  LogicalType::~LogicalType((LogicalType *)&large_enum);
  LogicalType::LogicalType(&local_a40,VARCHAR);
  Vector::Vector(&medium_enum,&local_a40,300);
  LogicalType::~LogicalType(&local_a40);
  pdVar5 = medium_enum.data + 8;
  for (uVar6 = 0; uVar6 != 300; uVar6 = uVar6 + 1) {
    ::std::__cxx11::string::string((string *)&max_map_value,"enum_",(allocator *)&int_list);
    ::std::__cxx11::to_string((string *)&empty_int_list,uVar6);
    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &large_enum,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &max_map_value,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &empty_int_list);
    string_t::string_t((string_t *)&local_1110.pointer,(string *)&large_enum);
    data_00.value.pointer.ptr = (char *)__args_2;
    data_00.value._0_8_ = local_1110.pointer.ptr;
    sVar7 = StringVector::AddStringOrBlob
                      ((StringVector *)&medium_enum,(Vector *)local_1110._0_8_,data_00);
    *(long *)(pdVar5 + -8) = sVar7.value._0_8_;
    *(long *)pdVar5 = sVar7.value._8_8_;
    ::std::__cxx11::string::~string((string *)&large_enum);
    ::std::__cxx11::string::~string((string *)&empty_int_list);
    ::std::__cxx11::string::~string((string *)&max_map_value);
    pdVar5 = pdVar5 + 0x10;
  }
  LogicalType::ENUM((LogicalType *)&large_enum,&medium_enum,300);
  ::std::vector<duckdb::TestType,std::allocator<duckdb::TestType>>::
  emplace_back<duckdb::LogicalType,char_const(&)[12]>
            ((vector<duckdb::TestType,std::allocator<duckdb::TestType>> *)__return_storage_ptr__,
             (LogicalType *)&large_enum,(char (*) [12])"medium_enum");
  LogicalType::~LogicalType((LogicalType *)&large_enum);
  if (use_large_enum) {
    LogicalType::LogicalType(&local_a58,VARCHAR);
    Vector::Vector(&large_enum,&local_a58,70000);
    LogicalType::~LogicalType(&local_a58);
    pdVar5 = large_enum.data + 8;
    for (uVar6 = 0; uVar6 != 70000; uVar6 = uVar6 + 1) {
      ::std::__cxx11::string::string
                ((string *)&empty_int_list,"enum_",(allocator *)&empty_double_list);
      ::std::__cxx11::to_string((string *)&int_list,uVar6);
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &max_map_value,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &empty_int_list,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &int_list);
      string_t::string_t((string_t *)&local_1120.pointer,(string *)&max_map_value);
      data_01.value.pointer.ptr = (char *)__args_2;
      data_01.value._0_8_ = local_1120.pointer.ptr;
      sVar7 = StringVector::AddStringOrBlob
                        ((StringVector *)&large_enum,(Vector *)local_1120._0_8_,data_01);
      *(long *)(pdVar5 + -8) = sVar7.value._0_8_;
      *(long *)pdVar5 = sVar7.value._8_8_;
      ::std::__cxx11::string::~string((string *)&max_map_value);
      ::std::__cxx11::string::~string((string *)&int_list);
      ::std::__cxx11::string::~string((string *)&empty_int_list);
      pdVar5 = pdVar5 + 0x10;
    }
    LogicalType::ENUM(&max_map_value.type_,&large_enum,70000);
    ::std::vector<duckdb::TestType,std::allocator<duckdb::TestType>>::
    emplace_back<duckdb::LogicalType,char_const(&)[11]>
              ((vector<duckdb::TestType,std::allocator<duckdb::TestType>> *)__return_storage_ptr__,
               &max_map_value.type_,(char (*) [11])0x1fcd283);
  }
  else {
    LogicalType::LogicalType(&local_a70,VARCHAR);
    Vector::Vector(&large_enum,&local_a70,2);
    LogicalType::~LogicalType(&local_a70);
    ::std::__cxx11::string::string
              ((string *)&empty_int_list,"enum_",(allocator *)&empty_double_list);
    ::std::__cxx11::to_string((string *)&int_list,0);
    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &max_map_value,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &empty_int_list,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&int_list)
    ;
    string_t::string_t((string_t *)&local_1130.pointer,(string *)&max_map_value);
    data_02.value.pointer.ptr = (char *)__args_2;
    data_02.value._0_8_ = local_1130.pointer.ptr;
    sVar7 = StringVector::AddStringOrBlob
                      ((StringVector *)&large_enum,(Vector *)local_1130._0_8_,data_02);
    *(anon_union_16_2_67f50693_for_value *)large_enum.data = sVar7.value;
    ::std::__cxx11::string::~string((string *)&max_map_value);
    ::std::__cxx11::string::~string((string *)&int_list);
    ::std::__cxx11::string::~string((string *)&empty_int_list);
    ::std::__cxx11::string::string
              ((string *)&empty_int_list,"enum_",(allocator *)&empty_double_list);
    ::std::__cxx11::to_string((string *)&int_list,69999);
    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &max_map_value,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &empty_int_list,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&int_list)
    ;
    string_t::string_t((string_t *)&local_1140.pointer,(string *)&max_map_value);
    data_03.value.pointer.ptr = (char *)__args_2;
    data_03.value._0_8_ = local_1140.pointer.ptr;
    aVar8 = (anon_struct_16_3_d7536bce_for_pointer)
            StringVector::AddStringOrBlob
                      ((StringVector *)&large_enum,local_1140.pointer._0_8_,data_03);
    ((anon_union_16_2_67f50693_for_value *)(large_enum.data + 0x10))->pointer = aVar8;
    ::std::__cxx11::string::~string((string *)&max_map_value);
    ::std::__cxx11::string::~string((string *)&int_list);
    ::std::__cxx11::string::~string((string *)&empty_int_list);
    LogicalType::ENUM(&max_map_value.type_,&large_enum,2);
    ::std::vector<duckdb::TestType,std::allocator<duckdb::TestType>>::
    emplace_back<duckdb::LogicalType,char_const(&)[11]>
              ((vector<duckdb::TestType,std::allocator<duckdb::TestType>> *)__return_storage_ptr__,
               &max_map_value.type_,(char (*) [11])0x1fcd283);
  }
  LogicalType::~LogicalType(&max_map_value.type_);
  Vector::~Vector(&large_enum);
  LogicalType::LogicalType((LogicalType *)&large_enum,INTEGER);
  LogicalType::LIST(&int_list_type,(LogicalType *)&large_enum);
  LogicalType::~LogicalType((LogicalType *)&large_enum);
  LogicalType::LogicalType((LogicalType *)&large_enum,INTEGER);
  local_768.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_768.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_768.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  Value::LIST(&empty_int_list,(LogicalType *)&large_enum,&local_768);
  ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
            ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_768);
  LogicalType::~LogicalType((LogicalType *)&large_enum);
  LogicalType::LogicalType(&max_map_value.type_,INTEGER);
  Value::INTEGER((Value *)&large_enum,0x2a);
  Value::INTEGER((Value *)&large_enum.validity.super_TemplatedValidityMask<unsigned_long>.capacity,
                 999);
  LogicalType::LogicalType(&local_aa0,INTEGER);
  Value::Value(&local_16a8,&local_aa0);
  LogicalType::LogicalType(&local_ab8,INTEGER);
  Value::Value(&local_1668,&local_ab8);
  Value::INTEGER(&local_1628,-0x2a);
  __l._M_len = 5;
  __l._M_array = (iterator)&large_enum;
  ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::vector
            ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_a88,__l,
             (allocator_type *)&empty_double_list);
  Value::LIST(&int_list,&max_map_value.type_,&local_a88);
  ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
            ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_a88);
  lVar4 = 0x100;
  do {
    Value::~Value((Value *)(&large_enum.vector_type + lVar4));
    lVar4 = lVar4 + -0x40;
  } while (lVar4 != -0x40);
  LogicalType::~LogicalType(&local_ab8);
  LogicalType::~LogicalType(&local_aa0);
  LogicalType::~LogicalType(&max_map_value.type_);
  ::std::vector<duckdb::TestType,std::allocator<duckdb::TestType>>::
  emplace_back<duckdb::LogicalType&,char_const(&)[10],duckdb::Value&,duckdb::Value&>
            ((vector<duckdb::TestType,std::allocator<duckdb::TestType>> *)__return_storage_ptr__,
             &int_list_type,(char (*) [10])0x1fcd1f2,&empty_int_list,&int_list);
  LogicalType::LogicalType((LogicalType *)&large_enum,DOUBLE);
  LogicalType::LIST(&double_list_type,(LogicalType *)&large_enum);
  LogicalType::~LogicalType((LogicalType *)&large_enum);
  LogicalType::LogicalType((LogicalType *)&large_enum,DOUBLE);
  local_788.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_788.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_788.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  Value::LIST(&empty_double_list,(LogicalType *)&large_enum,&local_788);
  ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
            ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_788);
  LogicalType::~LogicalType((LogicalType *)&large_enum);
  LogicalType::LogicalType(&max_map_value.type_,DOUBLE);
  Value::DOUBLE((Value *)&large_enum,42.0);
  Value::DOUBLE((Value *)&large_enum.validity.super_TemplatedValidityMask<unsigned_long>.capacity,
                NAN);
  Value::DOUBLE(&local_16a8,INFINITY);
  Value::DOUBLE(&local_1668,-INFINITY);
  LogicalType::LogicalType(&local_b00,DOUBLE);
  Value::Value(&local_1628,&local_b00);
  Value::DOUBLE(&local_15e8,-42.0);
  __l_00._M_len = 6;
  __l_00._M_array = (iterator)&large_enum;
  ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::vector
            ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_ae8,__l_00,
             (allocator_type *)&empty_date_list);
  Value::LIST(&double_list,&max_map_value.type_,&local_ae8);
  ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
            ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_ae8);
  lVar4 = 0x140;
  do {
    Value::~Value((Value *)(&large_enum.vector_type + lVar4));
    lVar4 = lVar4 + -0x40;
  } while (lVar4 != -0x40);
  LogicalType::~LogicalType(&local_b00);
  LogicalType::~LogicalType(&max_map_value.type_);
  ::std::vector<duckdb::TestType,std::allocator<duckdb::TestType>>::
  emplace_back<duckdb::LogicalType&,char_const(&)[13],duckdb::Value&,duckdb::Value&>
            ((vector<duckdb::TestType,std::allocator<duckdb::TestType>> *)__return_storage_ptr__,
             &double_list_type,(char (*) [13])"double_array",&empty_double_list,&double_list);
  LogicalType::LogicalType((LogicalType *)&large_enum,DATE);
  LogicalType::LIST(&date_list_type,(LogicalType *)&large_enum);
  LogicalType::~LogicalType((LogicalType *)&large_enum);
  LogicalType::LogicalType((LogicalType *)&large_enum,DATE);
  local_7a8.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_7a8.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_7a8.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  Value::LIST(&empty_date_list,(LogicalType *)&large_enum,&local_7a8);
  ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
            ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_7a8);
  LogicalType::~LogicalType((LogicalType *)&large_enum);
  LogicalType::LogicalType(&empty_timestamp_list.type_,DATE);
  Value::DATE((Value *)&large_enum,(date_t)0x0);
  Value::DATE((Value *)&large_enum.validity.super_TemplatedValidityMask<unsigned_long>.capacity,
              (date_t)0x7fffffff);
  Value::DATE(&local_16a8,(date_t)0x80000001);
  LogicalType::LogicalType(&local_b48,DATE);
  Value::Value(&local_1668,&local_b48);
  ::std::__cxx11::string::string((string *)&max_map_value,"2022-05-12",(allocator *)&timestamp_list)
  ;
  value = Date::FromString((string *)&max_map_value,false);
  Value::DATE(&local_1628,value);
  __l_01._M_len = 5;
  __l_01._M_array = (iterator)&large_enum;
  ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::vector
            ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_b30,__l_01,
             (allocator_type *)&empty_timestamptz_list);
  Value::LIST(&date_list,&empty_timestamp_list.type_,&local_b30);
  ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
            ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_b30);
  lVar4 = 0x100;
  do {
    Value::~Value((Value *)(&large_enum.vector_type + lVar4));
    lVar4 = lVar4 + -0x40;
  } while (lVar4 != -0x40);
  ::std::__cxx11::string::~string((string *)&max_map_value);
  LogicalType::~LogicalType(&local_b48);
  LogicalType::~LogicalType(&empty_timestamp_list.type_);
  ::std::vector<duckdb::TestType,std::allocator<duckdb::TestType>>::
  emplace_back<duckdb::LogicalType&,char_const(&)[11],duckdb::Value&,duckdb::Value&>
            ((vector<duckdb::TestType,std::allocator<duckdb::TestType>> *)__return_storage_ptr__,
             &date_list_type,(char (*) [11])"date_array",&empty_date_list,&date_list);
  LogicalType::LogicalType((LogicalType *)&large_enum,TIMESTAMP);
  LogicalType::LIST(&timestamp_list_type,(LogicalType *)&large_enum);
  LogicalType::~LogicalType((LogicalType *)&large_enum);
  LogicalType::LogicalType((LogicalType *)&large_enum,TIMESTAMP);
  local_7c8.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_7c8.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_7c8.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  Value::LIST(&empty_timestamp_list,(LogicalType *)&large_enum,&local_7c8);
  ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
            ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_7c8);
  LogicalType::~LogicalType((LogicalType *)&large_enum);
  LogicalType::LogicalType(&empty_timestamptz_list.type_,TIMESTAMP);
  Value::TIMESTAMP((Value *)&large_enum,(timestamp_t)0x0);
  Value::TIMESTAMP((Value *)&large_enum.validity.super_TemplatedValidityMask<unsigned_long>.capacity
                   ,(timestamp_t)0x7fffffffffffffff);
  Value::TIMESTAMP(&local_16a8,(timestamp_t)0x8000000000000001);
  LogicalType::LogicalType(&local_b90,TIMESTAMP);
  Value::Value(&local_1668,&local_b90);
  ::std::__cxx11::string::string
            ((string *)&max_map_value,"2022-05-12 16:23:45",(allocator *)&timestamptz_list);
  value_00 = Timestamp::FromString((string *)&max_map_value);
  Value::TIMESTAMP(&local_1628,value_00);
  __l_02._M_len = 5;
  __l_02._M_array = (iterator)&large_enum;
  ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::vector
            ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_b78,__l_02,
             (allocator_type *)&empty_varchar_list);
  Value::LIST(&timestamp_list,&empty_timestamptz_list.type_,&local_b78);
  ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
            ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_b78);
  lVar4 = 0x100;
  do {
    Value::~Value((Value *)(&large_enum.vector_type + lVar4));
    lVar4 = lVar4 + -0x40;
  } while (lVar4 != -0x40);
  ::std::__cxx11::string::~string((string *)&max_map_value);
  LogicalType::~LogicalType(&local_b90);
  LogicalType::~LogicalType(&empty_timestamptz_list.type_);
  ::std::vector<duckdb::TestType,std::allocator<duckdb::TestType>>::
  emplace_back<duckdb::LogicalType&,char_const(&)[16],duckdb::Value&,duckdb::Value&>
            ((vector<duckdb::TestType,std::allocator<duckdb::TestType>> *)__return_storage_ptr__,
             &timestamp_list_type,(char (*) [16])"timestamp_array",&empty_timestamp_list,
             &timestamp_list);
  LogicalType::LogicalType((LogicalType *)&large_enum,TIMESTAMP_TZ);
  LogicalType::LIST(&timestamptz_list_type,(LogicalType *)&large_enum);
  LogicalType::~LogicalType((LogicalType *)&large_enum);
  LogicalType::LogicalType((LogicalType *)&large_enum,TIMESTAMP_TZ);
  local_7e8.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_7e8.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_7e8.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  Value::LIST(&empty_timestamptz_list,(LogicalType *)&large_enum,&local_7e8);
  ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
            ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_7e8);
  LogicalType::~LogicalType((LogicalType *)&large_enum);
  LogicalType::LogicalType(&empty_varchar_list.type_,TIMESTAMP_TZ);
  Value::TIMESTAMPTZ((Value *)&large_enum,(timestamp_tz_t)0x0);
  Value::TIMESTAMPTZ((Value *)&large_enum.validity.super_TemplatedValidityMask<unsigned_long>.
                               capacity,(timestamp_tz_t)0x7fffffffffffffff);
  Value::TIMESTAMPTZ(&local_16a8,(timestamp_tz_t)0x8000000000000001);
  LogicalType::LogicalType(&local_bd8,TIMESTAMP_TZ);
  Value::Value(&local_1668,&local_bd8);
  ::std::__cxx11::string::string
            ((string *)&max_map_value,"2022-05-12 16:23:45-07",(allocator *)&varchar_list);
  value_01.super_timestamp_t.value = Timestamp::FromString((string *)&max_map_value);
  Value::TIMESTAMPTZ(&local_1628,value_01);
  __l_03._M_len = 5;
  __l_03._M_array = (iterator)&large_enum;
  ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::vector
            ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_bc0,__l_03,
             (allocator_type *)&empty_nested_list);
  Value::LIST(&timestamptz_list,&empty_varchar_list.type_,&local_bc0);
  ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
            ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_bc0);
  lVar4 = 0x100;
  do {
    Value::~Value((Value *)(&large_enum.vector_type + lVar4));
    lVar4 = lVar4 + -0x40;
  } while (lVar4 != -0x40);
  ::std::__cxx11::string::~string((string *)&max_map_value);
  LogicalType::~LogicalType(&local_bd8);
  LogicalType::~LogicalType(&empty_varchar_list.type_);
  ::std::vector<duckdb::TestType,std::allocator<duckdb::TestType>>::
  emplace_back<duckdb::LogicalType&,char_const(&)[18],duckdb::Value&,duckdb::Value&>
            ((vector<duckdb::TestType,std::allocator<duckdb::TestType>> *)__return_storage_ptr__,
             &timestamptz_list_type,(char (*) [18])"timestamptz_array",&empty_timestamptz_list,
             &timestamptz_list);
  LogicalType::LogicalType((LogicalType *)&large_enum,VARCHAR);
  LogicalType::LIST(&varchar_list_type,(LogicalType *)&large_enum);
  LogicalType::~LogicalType((LogicalType *)&large_enum);
  LogicalType::LogicalType((LogicalType *)&large_enum,VARCHAR);
  local_808.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_808.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_808.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  Value::LIST(&empty_varchar_list,(LogicalType *)&large_enum,&local_808);
  ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
            ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_808);
  LogicalType::~LogicalType((LogicalType *)&large_enum);
  LogicalType::LogicalType(&max_map_value.type_,VARCHAR);
  Value::Value((Value *)&large_enum,anon_var_dwarf_13b5ba0);
  Value::Value((Value *)&large_enum.validity.super_TemplatedValidityMask<unsigned_long>.capacity,
               "goose");
  LogicalType::LogicalType(&local_c08,VARCHAR);
  Value::Value(&local_16a8,&local_c08);
  Value::Value(&local_1668,anon_var_dwarf_3b6586a + 9);
  __l_04._M_len = 4;
  __l_04._M_array = (iterator)&large_enum;
  ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::vector
            ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_bf0,__l_04,
             (allocator_type *)&empty_nested_list);
  Value::LIST(&varchar_list,&max_map_value.type_,&local_bf0);
  ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
            ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_bf0);
  lVar4 = 0xc0;
  do {
    Value::~Value((Value *)(&large_enum.vector_type + lVar4));
    lVar4 = lVar4 + -0x40;
  } while (lVar4 != -0x40);
  LogicalType::~LogicalType(&local_c08);
  LogicalType::~LogicalType(&max_map_value.type_);
  ::std::vector<duckdb::TestType,std::allocator<duckdb::TestType>>::
  emplace_back<duckdb::LogicalType&,char_const(&)[14],duckdb::Value&,duckdb::Value&>
            ((vector<duckdb::TestType,std::allocator<duckdb::TestType>> *)__return_storage_ptr__,
             &varchar_list_type,(char (*) [14])0x1fcd209,&empty_varchar_list,&varchar_list);
  LogicalType::LIST(&nested_list_type,&int_list_type);
  local_828.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_828.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_828.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  Value::LIST(&empty_nested_list,&int_list_type,&local_828);
  ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
            ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_828);
  Value::Value((Value *)&large_enum,&empty_int_list);
  Value::Value((Value *)&large_enum.validity.super_TemplatedValidityMask<unsigned_long>.capacity,
               &int_list);
  LogicalType::LogicalType(&local_c50,&int_list_type);
  Value::Value(&local_16a8,&local_c50);
  Value::Value(&local_1668,&empty_int_list);
  Value::Value(&local_1628,&int_list);
  __l_05._M_len = 5;
  __l_05._M_array = (iterator)&large_enum;
  ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::vector
            ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_c38,__l_05,
             (allocator_type *)&max_map_value);
  Value::LIST(&nested_int_list,&int_list_type,&local_c38);
  ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
            ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_c38);
  lVar4 = 0x100;
  do {
    Value::~Value((Value *)(&large_enum.vector_type + lVar4));
    lVar4 = lVar4 + -0x40;
  } while (lVar4 != -0x40);
  LogicalType::~LogicalType(&local_c50);
  ::std::vector<duckdb::TestType,std::allocator<duckdb::TestType>>::
  emplace_back<duckdb::LogicalType&,char_const(&)[17],duckdb::Value&,duckdb::Value&>
            ((vector<duckdb::TestType,std::allocator<duckdb::TestType>> *)__return_storage_ptr__,
             &nested_list_type,(char (*) [17])0x1fcd1eb,&empty_nested_list,&nested_int_list);
  struct_type_list.
  super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
  .
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  struct_type_list.
  super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
  .
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  struct_type_list.
  super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
  .
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  max_map_value.type_._0_8_ = (long)"\\x00\\x00\\x00a" + 0xc;
  max_map_value.type_.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_1_ = 0xd;
  ::std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
  ::pair<const_char_*,_duckdb::LogicalTypeId,_true>
            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
              *)&large_enum,(pair<const_char_*,_duckdb::LogicalTypeId> *)&max_map_value);
  ::std::
  vector<std::pair<std::__cxx11::string,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string,duckdb::LogicalType>>>
  ::emplace_back<std::pair<std::__cxx11::string,duckdb::LogicalType>>
            ((vector<std::pair<std::__cxx11::string,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string,duckdb::LogicalType>>>
              *)&struct_type_list,
             (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
              *)&large_enum);
  ::std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
  ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
           *)&large_enum);
  max_map_value.type_._0_8_ = (long)"Need named argument for struct insert, e.g., a := b" + 0x32;
  max_map_value.type_.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_1_ = 0x19;
  ::std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
  ::pair<const_char_*,_duckdb::LogicalTypeId,_true>
            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
              *)&large_enum,(pair<const_char_*,_duckdb::LogicalTypeId> *)&max_map_value);
  ::std::
  vector<std::pair<std::__cxx11::string,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string,duckdb::LogicalType>>>
  ::emplace_back<std::pair<std::__cxx11::string,duckdb::LogicalType>>
            ((vector<std::pair<std::__cxx11::string,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string,duckdb::LogicalType>>>
              *)&struct_type_list,
             (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
              *)&large_enum);
  ::std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
  ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
           *)&large_enum);
  ::std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
  ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
            *)&local_c68,
           &struct_type_list.
            super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
          );
  LogicalType::STRUCT(&struct_type,&local_c68);
  ::std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
             *)&local_c68);
  min_struct_list.
  super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  .
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  min_struct_list.
  super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  .
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  min_struct_list.
  super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  .
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  LogicalType::LogicalType(&local_c80,INTEGER);
  Value::Value(&min_struct_val,&local_c80);
  psVar1 = &max_map_value.type_.type_info_;
  max_map_value.type_._0_8_ = (long)"\\x00\\x00\\x00a" + 0xc;
  Value::Value((Value *)psVar1,&min_struct_val);
  ::std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>
  ::pair<const_char_*,_duckdb::Value,_true>
            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>
              *)&large_enum,(pair<const_char_*,_duckdb::Value> *)&max_map_value);
  ::std::
  vector<std::pair<std::__cxx11::string,duckdb::Value>,std::allocator<std::pair<std::__cxx11::string,duckdb::Value>>>
  ::emplace_back<std::pair<std::__cxx11::string,duckdb::Value>>
            ((vector<std::pair<std::__cxx11::string,duckdb::Value>,std::allocator<std::pair<std::__cxx11::string,duckdb::Value>>>
              *)&min_struct_list,
             (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>
              *)&large_enum);
  ::std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>
  ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>
           *)&large_enum);
  Value::~Value((Value *)psVar1);
  Value::~Value(&min_struct_val);
  LogicalType::~LogicalType(&local_c80);
  LogicalType::LogicalType(&local_c98,VARCHAR);
  Value::Value(&min_struct_val,&local_c98);
  psVar1 = &max_map_value.type_.type_info_;
  max_map_value.type_._0_8_ = (long)"Need named argument for struct insert, e.g., a := b" + 0x32;
  Value::Value((Value *)psVar1,&min_struct_val);
  ::std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>
  ::pair<const_char_*,_duckdb::Value,_true>
            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>
              *)&large_enum,(pair<const_char_*,_duckdb::Value> *)&max_map_value);
  ::std::
  vector<std::pair<std::__cxx11::string,duckdb::Value>,std::allocator<std::pair<std::__cxx11::string,duckdb::Value>>>
  ::emplace_back<std::pair<std::__cxx11::string,duckdb::Value>>
            ((vector<std::pair<std::__cxx11::string,duckdb::Value>,std::allocator<std::pair<std::__cxx11::string,duckdb::Value>>>
              *)&min_struct_list,
             (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>
              *)&large_enum);
  ::std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>
  ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>
           *)&large_enum);
  Value::~Value((Value *)psVar1);
  Value::~Value(&min_struct_val);
  LogicalType::~LogicalType(&local_c98);
  local_848.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       min_struct_list.
       super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
       .
       super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_848.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       min_struct_list.
       super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
       .
       super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_848.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       min_struct_list.
       super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
       .
       super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  min_struct_list.
  super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  .
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  min_struct_list.
  super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  .
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  min_struct_list.
  super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  .
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Value::STRUCT(&min_struct_val,(child_list_t<Value> *)&local_848);
  ::std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  ::~vector(&local_848);
  max_struct_list.
  super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  .
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  max_struct_list.
  super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  .
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  max_struct_list.
  super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  .
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Value::INTEGER(&max_struct_val,0x2a);
  psVar1 = &max_map_value.type_.type_info_;
  max_map_value.type_._0_8_ = (long)"\\x00\\x00\\x00a" + 0xc;
  Value::Value((Value *)psVar1,&max_struct_val);
  ::std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>
  ::pair<const_char_*,_duckdb::Value,_true>
            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>
              *)&large_enum,(pair<const_char_*,_duckdb::Value> *)&max_map_value);
  ::std::
  vector<std::pair<std::__cxx11::string,duckdb::Value>,std::allocator<std::pair<std::__cxx11::string,duckdb::Value>>>
  ::emplace_back<std::pair<std::__cxx11::string,duckdb::Value>>
            ((vector<std::pair<std::__cxx11::string,duckdb::Value>,std::allocator<std::pair<std::__cxx11::string,duckdb::Value>>>
              *)&max_struct_list,
             (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>
              *)&large_enum);
  ::std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>
  ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>
           *)&large_enum);
  Value::~Value((Value *)psVar1);
  Value::~Value(&max_struct_val);
  Value::Value(&max_struct_val,anon_var_dwarf_13b5ba0);
  psVar1 = &max_map_value.type_.type_info_;
  max_map_value.type_._0_8_ = (long)"Need named argument for struct insert, e.g., a := b" + 0x32;
  Value::Value((Value *)psVar1,&max_struct_val);
  ::std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>
  ::pair<const_char_*,_duckdb::Value,_true>
            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>
              *)&large_enum,(pair<const_char_*,_duckdb::Value> *)&max_map_value);
  ::std::
  vector<std::pair<std::__cxx11::string,duckdb::Value>,std::allocator<std::pair<std::__cxx11::string,duckdb::Value>>>
  ::emplace_back<std::pair<std::__cxx11::string,duckdb::Value>>
            ((vector<std::pair<std::__cxx11::string,duckdb::Value>,std::allocator<std::pair<std::__cxx11::string,duckdb::Value>>>
              *)&max_struct_list,
             (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>
              *)&large_enum);
  ::std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>
  ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>
           *)&large_enum);
  Value::~Value((Value *)psVar1);
  Value::~Value(&max_struct_val);
  local_868.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       max_struct_list.
       super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
       .
       super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_868.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       max_struct_list.
       super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
       .
       super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_868.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       max_struct_list.
       super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
       .
       super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  max_struct_list.
  super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  .
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  max_struct_list.
  super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  .
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  max_struct_list.
  super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  .
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Value::STRUCT(&max_struct_val,(child_list_t<Value> *)&local_868);
  ::std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  ::~vector(&local_868);
  ::std::vector<duckdb::TestType,std::allocator<duckdb::TestType>>::
  emplace_back<duckdb::LogicalType&,char_const(&)[7],duckdb::Value&,duckdb::Value&>
            ((vector<duckdb::TestType,std::allocator<duckdb::TestType>> *)__return_storage_ptr__,
             &struct_type,(char (*) [7])0x1fca98b,&min_struct_val,&max_struct_val);
  struct_list_type_list.
  super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
  .
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  struct_list_type_list.
  super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
  .
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  struct_list_type_list.
  super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
  .
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  psVar1 = &max_map_value.type_.type_info_;
  max_map_value.type_._0_8_ = (long)"\\x00\\x00\\x00a" + 0xc;
  LogicalType::LogicalType((LogicalType *)psVar1,&int_list_type);
  ::std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
  ::pair<const_char_*,_duckdb::LogicalType,_true>
            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
              *)&large_enum,(pair<const_char_*,_duckdb::LogicalType> *)&max_map_value);
  ::std::
  vector<std::pair<std::__cxx11::string,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string,duckdb::LogicalType>>>
  ::emplace_back<std::pair<std::__cxx11::string,duckdb::LogicalType>>
            ((vector<std::pair<std::__cxx11::string,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string,duckdb::LogicalType>>>
              *)&struct_list_type_list,
             (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
              *)&large_enum);
  ::std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
  ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
           *)&large_enum);
  LogicalType::~LogicalType((LogicalType *)psVar1);
  psVar1 = &max_map_value.type_.type_info_;
  max_map_value.type_._0_8_ = (long)"Need named argument for struct insert, e.g., a := b" + 0x32;
  LogicalType::LogicalType((LogicalType *)psVar1,&varchar_list_type);
  ::std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
  ::pair<const_char_*,_duckdb::LogicalType,_true>
            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
              *)&large_enum,(pair<const_char_*,_duckdb::LogicalType> *)&max_map_value);
  ::std::
  vector<std::pair<std::__cxx11::string,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string,duckdb::LogicalType>>>
  ::emplace_back<std::pair<std::__cxx11::string,duckdb::LogicalType>>
            ((vector<std::pair<std::__cxx11::string,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string,duckdb::LogicalType>>>
              *)&struct_list_type_list,
             (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
              *)&large_enum);
  ::std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
  ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
           *)&large_enum);
  LogicalType::~LogicalType((LogicalType *)psVar1);
  ::std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
  ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
            *)&local_cc8,
           &struct_list_type_list.
            super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
          );
  LogicalType::STRUCT(&struct_list_type,&local_cc8);
  ::std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
             *)&local_cc8);
  min_struct_vl_list.
  super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  .
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  min_struct_vl_list.
  super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  .
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  min_struct_vl_list.
  super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  .
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  LogicalType::LogicalType(&local_ce0,&int_list_type);
  Value::Value(&min_struct_val_list,&local_ce0);
  psVar1 = &max_map_value.type_.type_info_;
  max_map_value.type_._0_8_ = (long)"\\x00\\x00\\x00a" + 0xc;
  Value::Value((Value *)psVar1,&min_struct_val_list);
  ::std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>
  ::pair<const_char_*,_duckdb::Value,_true>
            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>
              *)&large_enum,(pair<const_char_*,_duckdb::Value> *)&max_map_value);
  ::std::
  vector<std::pair<std::__cxx11::string,duckdb::Value>,std::allocator<std::pair<std::__cxx11::string,duckdb::Value>>>
  ::emplace_back<std::pair<std::__cxx11::string,duckdb::Value>>
            ((vector<std::pair<std::__cxx11::string,duckdb::Value>,std::allocator<std::pair<std::__cxx11::string,duckdb::Value>>>
              *)&min_struct_vl_list,
             (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>
              *)&large_enum);
  ::std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>
  ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>
           *)&large_enum);
  Value::~Value((Value *)psVar1);
  Value::~Value(&min_struct_val_list);
  LogicalType::~LogicalType(&local_ce0);
  LogicalType::LogicalType(&local_cf8,&varchar_list_type);
  Value::Value(&min_struct_val_list,&local_cf8);
  psVar1 = &max_map_value.type_.type_info_;
  max_map_value.type_._0_8_ = (long)"Need named argument for struct insert, e.g., a := b" + 0x32;
  Value::Value((Value *)psVar1,&min_struct_val_list);
  ::std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>
  ::pair<const_char_*,_duckdb::Value,_true>
            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>
              *)&large_enum,(pair<const_char_*,_duckdb::Value> *)&max_map_value);
  ::std::
  vector<std::pair<std::__cxx11::string,duckdb::Value>,std::allocator<std::pair<std::__cxx11::string,duckdb::Value>>>
  ::emplace_back<std::pair<std::__cxx11::string,duckdb::Value>>
            ((vector<std::pair<std::__cxx11::string,duckdb::Value>,std::allocator<std::pair<std::__cxx11::string,duckdb::Value>>>
              *)&min_struct_vl_list,
             (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>
              *)&large_enum);
  ::std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>
  ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>
           *)&large_enum);
  Value::~Value((Value *)psVar1);
  Value::~Value(&min_struct_val_list);
  LogicalType::~LogicalType(&local_cf8);
  local_888.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       min_struct_vl_list.
       super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
       .
       super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_888.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       min_struct_vl_list.
       super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
       .
       super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_888.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       min_struct_vl_list.
       super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
       .
       super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  min_struct_vl_list.
  super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  .
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  min_struct_vl_list.
  super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  .
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  min_struct_vl_list.
  super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  .
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Value::STRUCT(&min_struct_val_list,(child_list_t<Value> *)&local_888);
  ::std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  ::~vector(&local_888);
  max_struct_vl_list.
  super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  .
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  max_struct_vl_list.
  super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  .
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  max_struct_vl_list.
  super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  .
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  psVar1 = &max_map_value.type_.type_info_;
  max_map_value.type_._0_8_ = (long)"\\x00\\x00\\x00a" + 0xc;
  Value::Value((Value *)psVar1,&int_list);
  ::std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>
  ::pair<const_char_*,_duckdb::Value,_true>
            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>
              *)&large_enum,(pair<const_char_*,_duckdb::Value> *)&max_map_value);
  ::std::
  vector<std::pair<std::__cxx11::string,duckdb::Value>,std::allocator<std::pair<std::__cxx11::string,duckdb::Value>>>
  ::emplace_back<std::pair<std::__cxx11::string,duckdb::Value>>
            ((vector<std::pair<std::__cxx11::string,duckdb::Value>,std::allocator<std::pair<std::__cxx11::string,duckdb::Value>>>
              *)&max_struct_vl_list,
             (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>
              *)&large_enum);
  ::std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>
  ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>
           *)&large_enum);
  Value::~Value((Value *)psVar1);
  psVar1 = &max_map_value.type_.type_info_;
  max_map_value.type_._0_8_ = (long)"Need named argument for struct insert, e.g., a := b" + 0x32;
  Value::Value((Value *)psVar1,&varchar_list);
  ::std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>
  ::pair<const_char_*,_duckdb::Value,_true>
            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>
              *)&large_enum,(pair<const_char_*,_duckdb::Value> *)&max_map_value);
  ::std::
  vector<std::pair<std::__cxx11::string,duckdb::Value>,std::allocator<std::pair<std::__cxx11::string,duckdb::Value>>>
  ::emplace_back<std::pair<std::__cxx11::string,duckdb::Value>>
            ((vector<std::pair<std::__cxx11::string,duckdb::Value>,std::allocator<std::pair<std::__cxx11::string,duckdb::Value>>>
              *)&max_struct_vl_list,
             (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>
              *)&large_enum);
  ::std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>
  ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>
           *)&large_enum);
  Value::~Value((Value *)psVar1);
  local_8a8.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       max_struct_vl_list.
       super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
       .
       super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_8a8.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       max_struct_vl_list.
       super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
       .
       super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_8a8.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       max_struct_vl_list.
       super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
       .
       super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  max_struct_vl_list.
  super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  .
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  max_struct_vl_list.
  super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  .
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  max_struct_vl_list.
  super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  .
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Value::STRUCT(&max_struct_val_list,(child_list_t<Value> *)&local_8a8);
  ::std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  ::~vector(&local_8a8);
  ::std::vector<duckdb::TestType,std::allocator<duckdb::TestType>>::
  emplace_back<duckdb::LogicalType&,char_const(&)[17],duckdb::Value,duckdb::Value>
            ((vector<duckdb::TestType,std::allocator<duckdb::TestType>> *)__return_storage_ptr__,
             &struct_list_type,(char (*) [17])"struct_of_arrays",&min_struct_val_list,
             &max_struct_val_list);
  LogicalType::LIST(&array_of_structs_type,&struct_type);
  local_8c8.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_8c8.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_8c8.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  Value::LIST(&min_array_of_struct_val,&struct_type,&local_8c8);
  ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
            ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_8c8);
  Value::Value((Value *)&large_enum,&min_struct_val);
  Value::Value((Value *)&large_enum.validity.super_TemplatedValidityMask<unsigned_long>.capacity,
               &max_struct_val);
  LogicalType::LogicalType(&local_d40,&struct_type);
  Value::Value(&local_16a8,&local_d40);
  __l_06._M_len = 3;
  __l_06._M_array = (iterator)&large_enum;
  ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::vector
            ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_d28,__l_06,
             (allocator_type *)&max_map_value);
  Value::LIST(&max_array_of_struct_val,&struct_type,&local_d28);
  ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
            ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_d28);
  lVar4 = 0x80;
  do {
    Value::~Value((Value *)(&large_enum.vector_type + lVar4));
    lVar4 = lVar4 + -0x40;
  } while (lVar4 != -0x40);
  LogicalType::~LogicalType(&local_d40);
  ::std::vector<duckdb::TestType,std::allocator<duckdb::TestType>>::
  emplace_back<duckdb::LogicalType&,char_const(&)[17],duckdb::Value,duckdb::Value>
            ((vector<duckdb::TestType,std::allocator<duckdb::TestType>> *)__return_storage_ptr__,
             &array_of_structs_type,(char (*) [17])"array_of_structs",&min_array_of_struct_val,
             &max_array_of_struct_val);
  LogicalType::LogicalType(&local_d58,VARCHAR);
  LogicalType::LogicalType(&local_d70,VARCHAR);
  LogicalType::MAP(&map_type,&local_d58,&local_d70);
  LogicalType::~LogicalType(&local_d70);
  LogicalType::~LogicalType(&local_d58);
  pLVar3 = ListType::GetChildType(&map_type);
  local_8e8.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_8e8.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_8e8.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  Value::MAP(&min_map_value,pLVar3,&local_8e8);
  ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
            ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_8e8);
  map_struct1.
  super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  .
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  map_struct1.
  super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  .
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  map_struct1.
  super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  .
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Value::Value(&local_1448,"key1");
  psVar1 = &max_map_value.type_.type_info_;
  max_map_value.type_._0_8_ = (long)"Generic EC key" + 0xb;
  Value::Value((Value *)psVar1,&local_1448);
  ::std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>
  ::pair<const_char_*,_duckdb::Value,_true>
            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>
              *)&large_enum,(pair<const_char_*,_duckdb::Value> *)&max_map_value);
  ::std::
  vector<std::pair<std::__cxx11::string,duckdb::Value>,std::allocator<std::pair<std::__cxx11::string,duckdb::Value>>>
  ::emplace_back<std::pair<std::__cxx11::string,duckdb::Value>>
            ((vector<std::pair<std::__cxx11::string,duckdb::Value>,std::allocator<std::pair<std::__cxx11::string,duckdb::Value>>>
              *)&map_struct1,
             (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>
              *)&large_enum);
  ::std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>
  ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>
           *)&large_enum);
  Value::~Value((Value *)psVar1);
  Value::~Value(&local_1448);
  Value::Value(&local_1448,anon_var_dwarf_13b5ba0);
  psVar1 = &max_map_value.type_.type_info_;
  max_map_value.type_._0_8_ = (long)"read_csv %s cannot have empty (or all whitespace) value" + 0x32
  ;
  Value::Value((Value *)psVar1,&local_1448);
  ::std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>
  ::pair<const_char_*,_duckdb::Value,_true>
            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>
              *)&large_enum,(pair<const_char_*,_duckdb::Value> *)&max_map_value);
  ::std::
  vector<std::pair<std::__cxx11::string,duckdb::Value>,std::allocator<std::pair<std::__cxx11::string,duckdb::Value>>>
  ::emplace_back<std::pair<std::__cxx11::string,duckdb::Value>>
            ((vector<std::pair<std::__cxx11::string,duckdb::Value>,std::allocator<std::pair<std::__cxx11::string,duckdb::Value>>>
              *)&map_struct1,
             (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>
              *)&large_enum);
  ::std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>
  ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>
           *)&large_enum);
  Value::~Value((Value *)psVar1);
  Value::~Value(&local_1448);
  map_struct2.
  super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  .
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  map_struct2.
  super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  .
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  map_struct2.
  super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  .
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Value::Value(&local_1448,"key2");
  psVar1 = &max_map_value.type_.type_info_;
  max_map_value.type_._0_8_ = (long)"Generic EC key" + 0xb;
  Value::Value((Value *)psVar1,&local_1448);
  ::std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>
  ::pair<const_char_*,_duckdb::Value,_true>
            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>
              *)&large_enum,(pair<const_char_*,_duckdb::Value> *)&max_map_value);
  ::std::
  vector<std::pair<std::__cxx11::string,duckdb::Value>,std::allocator<std::pair<std::__cxx11::string,duckdb::Value>>>
  ::emplace_back<std::pair<std::__cxx11::string,duckdb::Value>>
            ((vector<std::pair<std::__cxx11::string,duckdb::Value>,std::allocator<std::pair<std::__cxx11::string,duckdb::Value>>>
              *)&map_struct2,
             (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>
              *)&large_enum);
  ::std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>
  ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>
           *)&large_enum);
  Value::~Value((Value *)psVar1);
  Value::~Value(&local_1448);
  Value::Value(&local_1448,"goose");
  psVar1 = &max_map_value.type_.type_info_;
  max_map_value.type_._0_8_ = (long)"read_csv %s cannot have empty (or all whitespace) value" + 0x32
  ;
  Value::Value((Value *)psVar1,&local_1448);
  ::std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>
  ::pair<const_char_*,_duckdb::Value,_true>
            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>
              *)&large_enum,(pair<const_char_*,_duckdb::Value> *)&max_map_value);
  ::std::
  vector<std::pair<std::__cxx11::string,duckdb::Value>,std::allocator<std::pair<std::__cxx11::string,duckdb::Value>>>
  ::emplace_back<std::pair<std::__cxx11::string,duckdb::Value>>
            ((vector<std::pair<std::__cxx11::string,duckdb::Value>,std::allocator<std::pair<std::__cxx11::string,duckdb::Value>>>
              *)&map_struct2,
             (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>
              *)&large_enum);
  ::std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>
  ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>
           *)&large_enum);
  Value::~Value((Value *)psVar1);
  Value::~Value(&local_1448);
  map_values.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  map_values.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  map_values.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  ::std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  ::vector(&local_d88,
           &map_struct1.
            super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
          );
  Value::STRUCT((Value *)&large_enum,(child_list_t<Value> *)&local_d88);
  ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::emplace_back<duckdb::Value>
            ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&map_values,
             (Value *)&large_enum);
  Value::~Value((Value *)&large_enum);
  ::std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  ::~vector(&local_d88);
  ::std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  ::vector(&local_da0,
           &map_struct2.
            super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
          );
  Value::STRUCT((Value *)&large_enum,(child_list_t<Value> *)&local_da0);
  ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::emplace_back<duckdb::Value>
            ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&map_values,
             (Value *)&large_enum);
  Value::~Value((Value *)&large_enum);
  ::std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  ::~vector(&local_da0);
  pLVar3 = ListType::GetChildType(&map_type);
  ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::vector
            ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_db8,
             &map_values.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>);
  Value::MAP(&max_map_value,pLVar3,&local_db8);
  ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
            ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_db8);
  ::std::vector<duckdb::TestType,std::allocator<duckdb::TestType>>::
  emplace_back<duckdb::LogicalType&,char_const(&)[4],duckdb::Value,duckdb::Value>
            ((vector<duckdb::TestType,std::allocator<duckdb::TestType>> *)__return_storage_ptr__,
             &map_type,(char (*) [4])0x210ad49,&min_map_value,&max_map_value);
  ::std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
  ::pair<const_char_(&)[5],_const_duckdb::LogicalTypeId_&,_true>
            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
              *)&large_enum,(char (*) [5])0x1fc892c,&LogicalType::VARCHAR);
  ::std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
  ::pair<const_char_(&)[4],_const_duckdb::LogicalTypeId_&,_true>
            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
              *)&large_enum.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.
                 internal.
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount,(char (*) [4])0x2039d5c,&LogicalType::SMALLINT);
  __l_07._M_len = 2;
  __l_07._M_array = (iterator)&large_enum;
  ::std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
  ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
            *)&members,__l_07,(allocator_type *)&local_1448);
  lVar4 = 0x38;
  do {
    ::std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
    ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
             *)(&large_enum.vector_type + lVar4));
    lVar4 = lVar4 + -0x38;
  } while (lVar4 != -0x38);
  ::std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
  ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
            *)&local_de8,
           &members.
            super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
          );
  LogicalType::UNION(&union_type,&local_de8);
  ::std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
             *)&local_de8);
  ::std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
  ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
            *)&local_e00,
           &members.
            super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
          );
  Value::Value(&local_230,"Frank");
  Value::UNION(&local_1448,&local_e00,'\0',&local_230);
  Value::~Value(&local_230);
  ::std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
             *)&local_e00);
  ::std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
  ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
            *)&local_e18,
           &members.
            super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
          );
  Value::SMALLINT(&local_2b0,5);
  Value::UNION(&local_270,&local_e18,'\x01',&local_2b0);
  Value::~Value(&local_2b0);
  ::std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
             *)&local_e18);
  ::std::vector<duckdb::TestType,std::allocator<duckdb::TestType>>::
  emplace_back<duckdb::LogicalType&,char_const(&)[6],duckdb::Value_const&,duckdb::Value_const&>
            ((vector<duckdb::TestType,std::allocator<duckdb::TestType>> *)__return_storage_ptr__,
             &union_type,(char (*) [6])0x1fc7ece,&local_1448,&local_270);
  LogicalType::LogicalType((LogicalType *)&large_enum,INTEGER);
  LogicalType::ARRAY(&fixed_int_array_type,(LogicalType *)&large_enum,(optional_idx)0x3);
  LogicalType::~LogicalType((LogicalType *)&large_enum);
  LogicalType::LogicalType(&fixed_int_max_array_value.type_,INTEGER);
  LogicalType::LogicalType(&local_e48,INTEGER);
  Value::Value((Value *)&large_enum,&local_e48);
  Value::Value((Value *)&large_enum.validity.super_TemplatedValidityMask<unsigned_long>.capacity,2);
  Value::Value(&local_16a8,3);
  __l_08._M_len = 3;
  __l_08._M_array = (iterator)&large_enum;
  ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::vector
            ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_e30,__l_08,
             (allocator_type *)&fixed_varchar_min_array_value);
  Value::ARRAY(&fixed_int_min_array_value,&fixed_int_max_array_value.type_,&local_e30);
  ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
            ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_e30);
  lVar4 = 0x80;
  do {
    Value::~Value((Value *)(&large_enum.vector_type + lVar4));
    lVar4 = lVar4 + -0x40;
  } while (lVar4 != -0x40);
  LogicalType::~LogicalType(&local_e48);
  LogicalType::~LogicalType(&fixed_int_max_array_value.type_);
  LogicalType::LogicalType(&fixed_varchar_min_array_value.type_,INTEGER);
  Value::Value((Value *)&large_enum,4);
  Value::Value((Value *)&large_enum.validity.super_TemplatedValidityMask<unsigned_long>.capacity,5);
  Value::Value(&local_16a8,6);
  __l_09._M_len = 3;
  __l_09._M_array = (iterator)&large_enum;
  ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::vector
            ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_e60,__l_09,
             (allocator_type *)&fixed_varchar_max_array_value);
  Value::ARRAY(&fixed_int_max_array_value,&fixed_varchar_min_array_value.type_,&local_e60);
  ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
            ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_e60);
  lVar4 = 0x80;
  do {
    Value::~Value((Value *)(&large_enum.vector_type + lVar4));
    lVar4 = lVar4 + -0x40;
  } while (lVar4 != -0x40);
  LogicalType::~LogicalType(&fixed_varchar_min_array_value.type_);
  ::std::vector<duckdb::TestType,std::allocator<duckdb::TestType>>::
  emplace_back<duckdb::LogicalType&,char_const(&)[16],duckdb::Value&,duckdb::Value&>
            ((vector<duckdb::TestType,std::allocator<duckdb::TestType>> *)__return_storage_ptr__,
             &fixed_int_array_type,(char (*) [16])0x1fcd260,&fixed_int_min_array_value,
             &fixed_int_max_array_value);
  LogicalType::LogicalType((LogicalType *)&large_enum,VARCHAR);
  LogicalType::ARRAY(&fixed_varchar_array_type,(LogicalType *)&large_enum,(optional_idx)0x3);
  LogicalType::~LogicalType((LogicalType *)&large_enum);
  LogicalType::LogicalType(&fixed_varchar_max_array_value.type_,VARCHAR);
  Value::Value((Value *)&large_enum,"a");
  LogicalType::LogicalType(&local_e90,VARCHAR);
  Value::Value((Value *)&large_enum.validity.super_TemplatedValidityMask<unsigned_long>.capacity,
               &local_e90);
  Value::Value(&local_16a8,"c");
  __l_10._M_len = 3;
  __l_10._M_array = (iterator)&large_enum;
  ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::vector
            ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_e78,__l_10,
             (allocator_type *)&fixed_nested_int_min_array_value);
  Value::ARRAY(&fixed_varchar_min_array_value,&fixed_varchar_max_array_value.type_,&local_e78);
  ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
            ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_e78);
  lVar4 = 0x80;
  do {
    Value::~Value((Value *)(&large_enum.vector_type + lVar4));
    lVar4 = lVar4 + -0x40;
  } while (lVar4 != -0x40);
  LogicalType::~LogicalType(&local_e90);
  LogicalType::~LogicalType(&fixed_varchar_max_array_value.type_);
  LogicalType::LogicalType(&fixed_nested_int_min_array_value.type_,VARCHAR);
  Value::Value((Value *)&large_enum,"d");
  Value::Value((Value *)&large_enum.validity.super_TemplatedValidityMask<unsigned_long>.capacity,"e"
              );
  Value::Value(&local_16a8,"f");
  __l_11._M_len = 3;
  __l_11._M_array = (iterator)&large_enum;
  ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::vector
            ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_ea8,__l_11,
             (allocator_type *)&fixed_nested_int_max_array_value);
  Value::ARRAY(&fixed_varchar_max_array_value,&fixed_nested_int_min_array_value.type_,&local_ea8);
  ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
            ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_ea8);
  lVar4 = 0x80;
  do {
    Value::~Value((Value *)(&large_enum.vector_type + lVar4));
    lVar4 = lVar4 + -0x40;
  } while (lVar4 != -0x40);
  LogicalType::~LogicalType(&fixed_nested_int_min_array_value.type_);
  ::std::vector<duckdb::TestType,std::allocator<duckdb::TestType>>::
  emplace_back<duckdb::LogicalType&,char_const(&)[20],duckdb::Value&,duckdb::Value&>
            ((vector<duckdb::TestType,std::allocator<duckdb::TestType>> *)__return_storage_ptr__,
             &fixed_varchar_array_type,(char (*) [20])"fixed_varchar_array",
             &fixed_varchar_min_array_value,&fixed_varchar_max_array_value);
  LogicalType::ARRAY(&fixed_nested_int_array_type,&fixed_int_array_type,(optional_idx)0x3);
  Value::Value((Value *)&large_enum,&fixed_int_min_array_value);
  LogicalType::LogicalType(&local_ef0,&fixed_int_array_type);
  Value::Value((Value *)&large_enum.validity.super_TemplatedValidityMask<unsigned_long>.capacity,
               &local_ef0);
  Value::Value(&local_16a8,&fixed_int_min_array_value);
  __l_12._M_len = 3;
  __l_12._M_array = (iterator)&large_enum;
  ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::vector
            ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_ed8,__l_12,
             (allocator_type *)&fixed_nested_int_max_array_value);
  Value::ARRAY(&fixed_nested_int_min_array_value,&fixed_int_array_type,&local_ed8);
  ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
            ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_ed8);
  lVar4 = 0x80;
  do {
    Value::~Value((Value *)(&large_enum.vector_type + lVar4));
    lVar4 = lVar4 + -0x40;
  } while (lVar4 != -0x40);
  LogicalType::~LogicalType(&local_ef0);
  Value::Value((Value *)&large_enum,&fixed_int_max_array_value);
  Value::Value((Value *)&large_enum.validity.super_TemplatedValidityMask<unsigned_long>.capacity,
               &fixed_int_min_array_value);
  Value::Value(&local_16a8,&fixed_int_max_array_value);
  __l_13._M_len = 3;
  __l_13._M_array = (iterator)&large_enum;
  ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::vector
            ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_f08,__l_13,
             (allocator_type *)&fixed_nested_varchar_min_array_value);
  Value::ARRAY(&fixed_nested_int_max_array_value,&fixed_int_array_type,&local_f08);
  ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
            ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_f08);
  lVar4 = 0x80;
  do {
    Value::~Value((Value *)(&large_enum.vector_type + lVar4));
    lVar4 = lVar4 + -0x40;
  } while (lVar4 != -0x40);
  ::std::vector<duckdb::TestType,std::allocator<duckdb::TestType>>::
  emplace_back<duckdb::LogicalType&,char_const(&)[23],duckdb::Value&,duckdb::Value&>
            ((vector<duckdb::TestType,std::allocator<duckdb::TestType>> *)__return_storage_ptr__,
             &fixed_nested_int_array_type,(char (*) [23])"fixed_nested_int_array",
             &fixed_nested_int_min_array_value,&fixed_nested_int_max_array_value);
  LogicalType::ARRAY(&fixed_nested_varchar_array_type,&fixed_varchar_array_type,(optional_idx)0x3);
  Value::Value((Value *)&large_enum,&fixed_varchar_min_array_value);
  LogicalType::LogicalType(&local_f50,&fixed_varchar_array_type);
  Value::Value((Value *)&large_enum.validity.super_TemplatedValidityMask<unsigned_long>.capacity,
               &local_f50);
  Value::Value(&local_16a8,&fixed_varchar_min_array_value);
  __l_14._M_len = 3;
  __l_14._M_array = (iterator)&large_enum;
  ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::vector
            ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_f38,__l_14,
             (allocator_type *)&fixed_nested_varchar_max_array_value);
  Value::ARRAY(&fixed_nested_varchar_min_array_value,&fixed_varchar_array_type,&local_f38);
  ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
            ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_f38);
  lVar4 = 0x80;
  do {
    Value::~Value((Value *)(&large_enum.vector_type + lVar4));
    lVar4 = lVar4 + -0x40;
  } while (lVar4 != -0x40);
  LogicalType::~LogicalType(&local_f50);
  Value::Value((Value *)&large_enum,&fixed_varchar_max_array_value);
  Value::Value((Value *)&large_enum.validity.super_TemplatedValidityMask<unsigned_long>.capacity,
               &fixed_varchar_min_array_value);
  Value::Value(&local_16a8,&fixed_varchar_max_array_value);
  __l_15._M_len = 3;
  __l_15._M_array = (iterator)&large_enum;
  ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::vector
            ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_f68,__l_15,
             (allocator_type *)&fixed_struct_min_array_value);
  Value::ARRAY(&fixed_nested_varchar_max_array_value,&fixed_varchar_array_type,&local_f68);
  ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
            ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_f68);
  lVar4 = 0x80;
  do {
    Value::~Value((Value *)(&large_enum.vector_type + lVar4));
    lVar4 = lVar4 + -0x40;
  } while (lVar4 != -0x40);
  ::std::vector<duckdb::TestType,std::allocator<duckdb::TestType>>::
  emplace_back<duckdb::LogicalType&,char_const(&)[27],duckdb::Value&,duckdb::Value&>
            ((vector<duckdb::TestType,std::allocator<duckdb::TestType>> *)__return_storage_ptr__,
             &fixed_nested_varchar_array_type,(char (*) [27])"fixed_nested_varchar_array",
             &fixed_nested_varchar_min_array_value,&fixed_nested_varchar_max_array_value);
  LogicalType::ARRAY(&fixed_struct_array_type,&struct_type,(optional_idx)0x3);
  Value::Value((Value *)&large_enum,&min_struct_val);
  Value::Value((Value *)&large_enum.validity.super_TemplatedValidityMask<unsigned_long>.capacity,
               &max_struct_val);
  Value::Value(&local_16a8,&min_struct_val);
  __l_16._M_len = 3;
  __l_16._M_array = (iterator)&large_enum;
  ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::vector
            ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_f98,__l_16,
             (allocator_type *)&fixed_struct_max_array_value);
  Value::ARRAY(&fixed_struct_min_array_value,&struct_type,&local_f98);
  ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
            ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_f98);
  lVar4 = 0x80;
  do {
    Value::~Value((Value *)(&large_enum.vector_type + lVar4));
    lVar4 = lVar4 + -0x40;
  } while (lVar4 != -0x40);
  Value::Value((Value *)&large_enum,&max_struct_val);
  Value::Value((Value *)&large_enum.validity.super_TemplatedValidityMask<unsigned_long>.capacity,
               &min_struct_val);
  Value::Value(&local_16a8,&max_struct_val);
  __l_17._M_len = 3;
  __l_17._M_array = (iterator)&large_enum;
  ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::vector
            ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_fb0,__l_17,
             (allocator_type *)&struct_of_fixed_array_min_value);
  Value::ARRAY(&fixed_struct_max_array_value,&struct_type,&local_fb0);
  ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
            ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_fb0);
  lVar4 = 0x80;
  do {
    Value::~Value((Value *)(&large_enum.vector_type + lVar4));
    lVar4 = lVar4 + -0x40;
  } while (lVar4 != -0x40);
  ::std::vector<duckdb::TestType,std::allocator<duckdb::TestType>>::
  emplace_back<duckdb::LogicalType&,char_const(&)[19],duckdb::Value&,duckdb::Value&>
            ((vector<duckdb::TestType,std::allocator<duckdb::TestType>> *)__return_storage_ptr__,
             &fixed_struct_array_type,(char (*) [19])"fixed_struct_array",
             &fixed_struct_min_array_value,&fixed_struct_max_array_value);
  ::std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
  ::pair<const_char_(&)[2],_duckdb::LogicalType_&,_true>
            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
              *)&large_enum,(char (*) [2])0x1fcd0d5,&fixed_int_array_type);
  ::std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
  ::pair<const_char_(&)[2],_duckdb::LogicalType_&,_true>
            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
              *)&large_enum.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.
                 internal.
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount,(char (*) [2])0x210be06,&fixed_varchar_array_type);
  __l_18._M_len = 2;
  __l_18._M_array = (iterator)&large_enum;
  ::std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
  ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
            *)&local_fe0,__l_18,(allocator_type *)&struct_of_fixed_array_min_value);
  LogicalType::STRUCT(&struct_of_fixed_array_type,&local_fe0);
  ::std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
             *)&local_fe0);
  lVar4 = 0x38;
  do {
    ::std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
    ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
             *)(&large_enum.vector_type + lVar4));
    lVar4 = lVar4 + -0x38;
  } while (lVar4 != -0x38);
  ::std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>
  ::pair<const_char_(&)[2],_duckdb::Value_&,_true>
            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>
              *)&large_enum,(char (*) [2])0x1fcd0d5,&fixed_int_min_array_value);
  ::std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>
  ::pair<const_char_(&)[2],_duckdb::Value_&,_true>
            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>
              *)&large_enum.auxiliary.internal.
                 super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (char (*) [2])0x210be06,&fixed_varchar_min_array_value);
  __l_19._M_len = 2;
  __l_19._M_array = (iterator)&large_enum;
  ::std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  ::vector(&local_ff8,__l_19,(allocator_type *)&struct_of_fixed_array_max_value);
  Value::STRUCT(&struct_of_fixed_array_min_value,(child_list_t<Value> *)&local_ff8);
  ::std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  ::~vector(&local_ff8);
  lVar4 = 0x60;
  do {
    ::std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>
    ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>
             *)(&large_enum.vector_type + lVar4));
    lVar4 = lVar4 + -0x60;
  } while (lVar4 != -0x60);
  ::std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>
  ::pair<const_char_(&)[2],_duckdb::Value_&,_true>
            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>
              *)&large_enum,(char (*) [2])0x1fcd0d5,&fixed_int_max_array_value);
  ::std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>
  ::pair<const_char_(&)[2],_duckdb::Value_&,_true>
            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>
              *)&large_enum.auxiliary.internal.
                 super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (char (*) [2])0x210be06,&fixed_varchar_max_array_value);
  __l_20._M_len = 2;
  __l_20._M_array = (iterator)&large_enum;
  ::std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  ::vector(&local_1010,__l_20,(allocator_type *)&fixed_array_of_list_of_int_min_value);
  Value::STRUCT(&struct_of_fixed_array_max_value,(child_list_t<Value> *)&local_1010);
  ::std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  ::~vector(&local_1010);
  lVar4 = 0x60;
  do {
    ::std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>
    ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>
             *)(&large_enum.vector_type + lVar4));
    lVar4 = lVar4 + -0x60;
  } while (lVar4 != -0x60);
  ::std::vector<duckdb::TestType,std::allocator<duckdb::TestType>>::
  emplace_back<duckdb::LogicalType&,char_const(&)[22],duckdb::Value&,duckdb::Value&>
            ((vector<duckdb::TestType,std::allocator<duckdb::TestType>> *)__return_storage_ptr__,
             &struct_of_fixed_array_type,(char (*) [22])"struct_of_fixed_array",
             &struct_of_fixed_array_min_value,&struct_of_fixed_array_max_value);
  LogicalType::ARRAY(&fixed_array_of_list_of_int_type,&int_list_type,(optional_idx)0x3);
  Value::Value((Value *)&large_enum,&empty_int_list);
  Value::Value((Value *)&large_enum.validity.super_TemplatedValidityMask<unsigned_long>.capacity,
               &int_list);
  Value::Value(&local_16a8,&empty_int_list);
  __l_21._M_len = 3;
  __l_21._M_array = (iterator)&large_enum;
  ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::vector
            ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_1040,__l_21,
             (allocator_type *)&fixed_array_of_list_of_int_max_value);
  Value::ARRAY(&fixed_array_of_list_of_int_min_value,&int_list_type,&local_1040);
  ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
            ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_1040);
  lVar4 = 0x80;
  do {
    Value::~Value((Value *)(&large_enum.vector_type + lVar4));
    lVar4 = lVar4 + -0x40;
  } while (lVar4 != -0x40);
  Value::Value((Value *)&large_enum,&int_list);
  Value::Value((Value *)&large_enum.validity.super_TemplatedValidityMask<unsigned_long>.capacity,
               &empty_int_list);
  Value::Value(&local_16a8,&int_list);
  __l_22._M_len = 3;
  __l_22._M_array = (iterator)&large_enum;
  ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::vector
            ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_1058,__l_22,
             (allocator_type *)&list_of_fixed_array_of_int_min_value);
  Value::ARRAY(&fixed_array_of_list_of_int_max_value,&int_list_type,&local_1058);
  ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
            ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_1058);
  lVar4 = 0x80;
  do {
    Value::~Value((Value *)(&large_enum.vector_type + lVar4));
    lVar4 = lVar4 + -0x40;
  } while (lVar4 != -0x40);
  ::std::vector<duckdb::TestType,std::allocator<duckdb::TestType>>::
  emplace_back<duckdb::LogicalType&,char_const(&)[24],duckdb::Value&,duckdb::Value&>
            ((vector<duckdb::TestType,std::allocator<duckdb::TestType>> *)__return_storage_ptr__,
             &fixed_array_of_list_of_int_type,(char (*) [24])"fixed_array_of_int_list",
             &fixed_array_of_list_of_int_min_value,&fixed_array_of_list_of_int_max_value);
  LogicalType::LIST(&list_of_fixed_array_of_int_type,&fixed_int_array_type);
  Value::Value((Value *)&large_enum,&fixed_int_min_array_value);
  Value::Value((Value *)&large_enum.validity.super_TemplatedValidityMask<unsigned_long>.capacity,
               &fixed_int_max_array_value);
  Value::Value(&local_16a8,&fixed_int_min_array_value);
  __l_23._M_len = 3;
  __l_23._M_array = (iterator)&large_enum;
  ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::vector
            ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_1088,__l_23,
             (allocator_type *)&list_of_fixed_array_of_int_max_value);
  Value::LIST(&list_of_fixed_array_of_int_min_value,&fixed_int_array_type,&local_1088);
  ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
            ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_1088);
  lVar4 = 0x80;
  do {
    Value::~Value((Value *)(&large_enum.vector_type + lVar4));
    lVar4 = lVar4 + -0x40;
  } while (lVar4 != -0x40);
  Value::Value((Value *)&large_enum,&fixed_int_max_array_value);
  Value::Value((Value *)&large_enum.validity.super_TemplatedValidityMask<unsigned_long>.capacity,
               &fixed_int_min_array_value);
  Value::Value(&local_16a8,&fixed_int_max_array_value);
  __l_24._M_len = 3;
  __l_24._M_array = (iterator)&large_enum;
  ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::vector
            ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_10a0,__l_24,&local_1729
            );
  Value::LIST(&list_of_fixed_array_of_int_max_value,&fixed_int_array_type,&local_10a0);
  ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
            ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_10a0);
  lVar4 = 0x80;
  do {
    Value::~Value((Value *)(&large_enum.vector_type + lVar4));
    lVar4 = lVar4 + -0x40;
  } while (lVar4 != -0x40);
  ::std::vector<duckdb::TestType,std::allocator<duckdb::TestType>>::
  emplace_back<duckdb::LogicalType&,char_const(&)[24],duckdb::Value&,duckdb::Value&>
            ((vector<duckdb::TestType,std::allocator<duckdb::TestType>> *)__return_storage_ptr__,
             &list_of_fixed_array_of_int_type,(char (*) [24])"list_of_fixed_int_array",
             &list_of_fixed_array_of_int_min_value,&list_of_fixed_array_of_int_max_value);
  Value::~Value(&list_of_fixed_array_of_int_max_value);
  Value::~Value(&list_of_fixed_array_of_int_min_value);
  LogicalType::~LogicalType(&list_of_fixed_array_of_int_type);
  Value::~Value(&fixed_array_of_list_of_int_max_value);
  Value::~Value(&fixed_array_of_list_of_int_min_value);
  LogicalType::~LogicalType(&fixed_array_of_list_of_int_type);
  Value::~Value(&struct_of_fixed_array_max_value);
  Value::~Value(&struct_of_fixed_array_min_value);
  LogicalType::~LogicalType(&struct_of_fixed_array_type);
  Value::~Value(&fixed_struct_max_array_value);
  Value::~Value(&fixed_struct_min_array_value);
  LogicalType::~LogicalType(&fixed_struct_array_type);
  Value::~Value(&fixed_nested_varchar_max_array_value);
  Value::~Value(&fixed_nested_varchar_min_array_value);
  LogicalType::~LogicalType(&fixed_nested_varchar_array_type);
  Value::~Value(&fixed_nested_int_max_array_value);
  Value::~Value(&fixed_nested_int_min_array_value);
  LogicalType::~LogicalType(&fixed_nested_int_array_type);
  Value::~Value(&fixed_varchar_max_array_value);
  Value::~Value(&fixed_varchar_min_array_value);
  LogicalType::~LogicalType(&fixed_varchar_array_type);
  Value::~Value(&fixed_int_max_array_value);
  Value::~Value(&fixed_int_min_array_value);
  LogicalType::~LogicalType(&fixed_int_array_type);
  Value::~Value(&local_270);
  Value::~Value(&local_1448);
  LogicalType::~LogicalType(&union_type);
  ::std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
             *)&members);
  Value::~Value(&max_map_value);
  ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
            ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&map_values);
  ::std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  ::~vector(&map_struct2.
             super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
           );
  ::std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  ::~vector(&map_struct1.
             super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
           );
  Value::~Value(&min_map_value);
  LogicalType::~LogicalType(&map_type);
  Value::~Value(&max_array_of_struct_val);
  Value::~Value(&min_array_of_struct_val);
  LogicalType::~LogicalType(&array_of_structs_type);
  Value::~Value(&max_struct_val_list);
  ::std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  ::~vector(&max_struct_vl_list.
             super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
           );
  Value::~Value(&min_struct_val_list);
  ::std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  ::~vector(&min_struct_vl_list.
             super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
           );
  LogicalType::~LogicalType(&struct_list_type);
  ::std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
             *)&struct_list_type_list);
  Value::~Value(&max_struct_val);
  ::std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  ::~vector(&max_struct_list.
             super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
           );
  Value::~Value(&min_struct_val);
  ::std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  ::~vector(&min_struct_list.
             super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
           );
  LogicalType::~LogicalType(&struct_type);
  ::std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
             *)&struct_type_list);
  Value::~Value(&nested_int_list);
  Value::~Value(&empty_nested_list);
  LogicalType::~LogicalType(&nested_list_type);
  Value::~Value(&varchar_list);
  Value::~Value(&empty_varchar_list);
  LogicalType::~LogicalType(&varchar_list_type);
  Value::~Value(&timestamptz_list);
  Value::~Value(&empty_timestamptz_list);
  LogicalType::~LogicalType(&timestamptz_list_type);
  Value::~Value(&timestamp_list);
  Value::~Value(&empty_timestamp_list);
  LogicalType::~LogicalType(&timestamp_list_type);
  Value::~Value(&date_list);
  Value::~Value(&empty_date_list);
  LogicalType::~LogicalType(&date_list_type);
  Value::~Value(&double_list);
  Value::~Value(&empty_double_list);
  LogicalType::~LogicalType(&double_list_type);
  Value::~Value(&int_list);
  Value::~Value(&empty_int_list);
  LogicalType::~LogicalType(&int_list_type);
  Vector::~Vector(&medium_enum);
  Vector::~Vector(&small_enum);
  return __return_storage_ptr__;
}

Assistant:

vector<TestType> TestAllTypesFun::GetTestTypes(bool use_large_enum) {
	vector<TestType> result;
	// scalar types/numerics
	result.emplace_back(LogicalType::BOOLEAN, "bool");
	result.emplace_back(LogicalType::TINYINT, "tinyint");
	result.emplace_back(LogicalType::SMALLINT, "smallint");
	result.emplace_back(LogicalType::INTEGER, "int");
	result.emplace_back(LogicalType::BIGINT, "bigint");
	result.emplace_back(LogicalType::HUGEINT, "hugeint");
	result.emplace_back(LogicalType::UHUGEINT, "uhugeint");
	result.emplace_back(LogicalType::UTINYINT, "utinyint");
	result.emplace_back(LogicalType::USMALLINT, "usmallint");
	result.emplace_back(LogicalType::UINTEGER, "uint");
	result.emplace_back(LogicalType::UBIGINT, "ubigint");
	result.emplace_back(LogicalType::VARINT, "varint");
	result.emplace_back(LogicalType::DATE, "date");
	result.emplace_back(LogicalType::TIME, "time");
	result.emplace_back(LogicalType::TIMESTAMP, "timestamp");
	result.emplace_back(LogicalType::TIMESTAMP_S, "timestamp_s");
	result.emplace_back(LogicalType::TIMESTAMP_MS, "timestamp_ms");
	result.emplace_back(LogicalType::TIMESTAMP_NS, "timestamp_ns");
	result.emplace_back(LogicalType::TIME_TZ, "time_tz");
	result.emplace_back(LogicalType::TIMESTAMP_TZ, "timestamp_tz");
	result.emplace_back(LogicalType::FLOAT, "float");
	result.emplace_back(LogicalType::DOUBLE, "double");
	result.emplace_back(LogicalType::DECIMAL(4, 1), "dec_4_1");
	result.emplace_back(LogicalType::DECIMAL(9, 4), "dec_9_4");
	result.emplace_back(LogicalType::DECIMAL(18, 6), "dec_18_6");
	result.emplace_back(LogicalType::DECIMAL(38, 10), "dec38_10");
	result.emplace_back(LogicalType::UUID, "uuid");

	// interval
	interval_t min_interval;
	min_interval.months = 0;
	min_interval.days = 0;
	min_interval.micros = 0;

	interval_t max_interval;
	max_interval.months = 999;
	max_interval.days = 999;
	max_interval.micros = 999999999;
	result.emplace_back(LogicalType::INTERVAL, "interval", Value::INTERVAL(min_interval),
	                    Value::INTERVAL(max_interval));
	// strings/blobs/bitstrings
	result.emplace_back(LogicalType::VARCHAR, "varchar", Value("🦆🦆🦆🦆🦆🦆"),
	                    Value(string("goo\x00se", 6)));
	result.emplace_back(LogicalType::BLOB, "blob", Value::BLOB("thisisalongblob\\x00withnullbytes"),
	                    Value::BLOB("\\x00\\x00\\x00a"));
	result.emplace_back(LogicalType::BIT, "bit", Value::BIT("0010001001011100010101011010111"), Value::BIT("10101"));

	// enums
	Vector small_enum(LogicalType::VARCHAR, 2);
	auto small_enum_ptr = FlatVector::GetData<string_t>(small_enum);
	small_enum_ptr[0] = StringVector::AddStringOrBlob(small_enum, "DUCK_DUCK_ENUM");
	small_enum_ptr[1] = StringVector::AddStringOrBlob(small_enum, "GOOSE");
	result.emplace_back(LogicalType::ENUM(small_enum, 2), "small_enum");

	Vector medium_enum(LogicalType::VARCHAR, 300);
	auto medium_enum_ptr = FlatVector::GetData<string_t>(medium_enum);
	for (idx_t i = 0; i < 300; i++) {
		medium_enum_ptr[i] = StringVector::AddStringOrBlob(medium_enum, string("enum_") + to_string(i));
	}
	result.emplace_back(LogicalType::ENUM(medium_enum, 300), "medium_enum");

	if (use_large_enum) {
		// this is a big one... not sure if we should push this one here, but it's required for completeness
		Vector large_enum(LogicalType::VARCHAR, 70000);
		auto large_enum_ptr = FlatVector::GetData<string_t>(large_enum);
		for (idx_t i = 0; i < 70000; i++) {
			large_enum_ptr[i] = StringVector::AddStringOrBlob(large_enum, string("enum_") + to_string(i));
		}
		result.emplace_back(LogicalType::ENUM(large_enum, 70000), "large_enum");
	} else {
		Vector large_enum(LogicalType::VARCHAR, 2);
		auto large_enum_ptr = FlatVector::GetData<string_t>(large_enum);
		large_enum_ptr[0] = StringVector::AddStringOrBlob(large_enum, string("enum_") + to_string(0));
		large_enum_ptr[1] = StringVector::AddStringOrBlob(large_enum, string("enum_") + to_string(69999));
		result.emplace_back(LogicalType::ENUM(large_enum, 2), "large_enum");
	}

	// arrays
	auto int_list_type = LogicalType::LIST(LogicalType::INTEGER);
	auto empty_int_list = Value::LIST(LogicalType::INTEGER, vector<Value>());
	auto int_list =
	    Value::LIST(LogicalType::INTEGER, {Value::INTEGER(42), Value::INTEGER(999), Value(LogicalType::INTEGER),
	                                       Value(LogicalType::INTEGER), Value::INTEGER(-42)});
	result.emplace_back(int_list_type, "int_array", empty_int_list, int_list);

	auto double_list_type = LogicalType::LIST(LogicalType::DOUBLE);
	auto empty_double_list = Value::LIST(LogicalType::DOUBLE, vector<Value>());
	auto double_list = Value::LIST(LogicalType::DOUBLE, {Value::DOUBLE(42), Value::DOUBLE(NAN),
	                                                     Value::DOUBLE(std::numeric_limits<double>::infinity()),
	                                                     Value::DOUBLE(-std::numeric_limits<double>::infinity()),
	                                                     Value(LogicalType::DOUBLE), Value::DOUBLE(-42)});
	result.emplace_back(double_list_type, "double_array", empty_double_list, double_list);

	auto date_list_type = LogicalType::LIST(LogicalType::DATE);
	auto empty_date_list = Value::LIST(LogicalType::DATE, vector<Value>());
	auto date_list = Value::LIST(LogicalType::DATE, {Value::DATE(date_t()), Value::DATE(date_t::infinity()),
	                                                 Value::DATE(date_t::ninfinity()), Value(LogicalType::DATE),
	                                                 Value::DATE(Date::FromString("2022-05-12"))});
	result.emplace_back(date_list_type, "date_array", empty_date_list, date_list);

	auto timestamp_list_type = LogicalType::LIST(LogicalType::TIMESTAMP);
	auto empty_timestamp_list = Value::LIST(LogicalType::TIMESTAMP, vector<Value>());
	auto timestamp_list =
	    Value::LIST(LogicalType::TIMESTAMP, {Value::TIMESTAMP(timestamp_t()), Value::TIMESTAMP(timestamp_t::infinity()),
	                                         Value::TIMESTAMP(timestamp_t::ninfinity()), Value(LogicalType::TIMESTAMP),
	                                         Value::TIMESTAMP(Timestamp::FromString("2022-05-12 16:23:45"))});
	result.emplace_back(timestamp_list_type, "timestamp_array", empty_timestamp_list, timestamp_list);

	auto timestamptz_list_type = LogicalType::LIST(LogicalType::TIMESTAMP_TZ);
	auto empty_timestamptz_list = Value::LIST(LogicalType::TIMESTAMP_TZ, vector<Value>());
	auto timestamptz_list =
	    Value::LIST(LogicalType::TIMESTAMP_TZ,
	                {Value::TIMESTAMPTZ(timestamp_tz_t()), Value::TIMESTAMPTZ(timestamp_tz_t(timestamp_t::infinity())),
	                 Value::TIMESTAMPTZ(timestamp_tz_t(timestamp_t::ninfinity())), Value(LogicalType::TIMESTAMP_TZ),
	                 Value::TIMESTAMPTZ(timestamp_tz_t(Timestamp::FromString("2022-05-12 16:23:45-07")))});
	result.emplace_back(timestamptz_list_type, "timestamptz_array", empty_timestamptz_list, timestamptz_list);

	auto varchar_list_type = LogicalType::LIST(LogicalType::VARCHAR);
	auto empty_varchar_list = Value::LIST(LogicalType::VARCHAR, vector<Value>());
	auto varchar_list = Value::LIST(LogicalType::VARCHAR, {Value("🦆🦆🦆🦆🦆🦆"), Value("goose"),
	                                                       Value(LogicalType::VARCHAR), Value("")});
	result.emplace_back(varchar_list_type, "varchar_array", empty_varchar_list, varchar_list);

	// nested arrays
	auto nested_list_type = LogicalType::LIST(int_list_type);
	auto empty_nested_list = Value::LIST(int_list_type, vector<Value>());
	auto nested_int_list =
	    Value::LIST(int_list_type, {empty_int_list, int_list, Value(int_list_type), empty_int_list, int_list});
	result.emplace_back(nested_list_type, "nested_int_array", empty_nested_list, nested_int_list);

	// structs
	child_list_t<LogicalType> struct_type_list;
	struct_type_list.push_back(make_pair("a", LogicalType::INTEGER));
	struct_type_list.push_back(make_pair("b", LogicalType::VARCHAR));
	auto struct_type = LogicalType::STRUCT(struct_type_list);

	child_list_t<Value> min_struct_list;
	min_struct_list.push_back(make_pair("a", Value(LogicalType::INTEGER)));
	min_struct_list.push_back(make_pair("b", Value(LogicalType::VARCHAR)));
	auto min_struct_val = Value::STRUCT(std::move(min_struct_list));

	child_list_t<Value> max_struct_list;
	max_struct_list.push_back(make_pair("a", Value::INTEGER(42)));
	max_struct_list.push_back(make_pair("b", Value("🦆🦆🦆🦆🦆🦆")));
	auto max_struct_val = Value::STRUCT(std::move(max_struct_list));

	result.emplace_back(struct_type, "struct", min_struct_val, max_struct_val);

	// structs with lists
	child_list_t<LogicalType> struct_list_type_list;
	struct_list_type_list.push_back(make_pair("a", int_list_type));
	struct_list_type_list.push_back(make_pair("b", varchar_list_type));
	auto struct_list_type = LogicalType::STRUCT(struct_list_type_list);

	child_list_t<Value> min_struct_vl_list;
	min_struct_vl_list.push_back(make_pair("a", Value(int_list_type)));
	min_struct_vl_list.push_back(make_pair("b", Value(varchar_list_type)));
	auto min_struct_val_list = Value::STRUCT(std::move(min_struct_vl_list));

	child_list_t<Value> max_struct_vl_list;
	max_struct_vl_list.push_back(make_pair("a", int_list));
	max_struct_vl_list.push_back(make_pair("b", varchar_list));
	auto max_struct_val_list = Value::STRUCT(std::move(max_struct_vl_list));

	result.emplace_back(struct_list_type, "struct_of_arrays", std::move(min_struct_val_list),
	                    std::move(max_struct_val_list));

	// array of structs
	auto array_of_structs_type = LogicalType::LIST(struct_type);
	auto min_array_of_struct_val = Value::LIST(struct_type, vector<Value>());
	auto max_array_of_struct_val = Value::LIST(struct_type, {min_struct_val, max_struct_val, Value(struct_type)});
	result.emplace_back(array_of_structs_type, "array_of_structs", std::move(min_array_of_struct_val),
	                    std::move(max_array_of_struct_val));

	// map
	auto map_type = LogicalType::MAP(LogicalType::VARCHAR, LogicalType::VARCHAR);
	auto min_map_value = Value::MAP(ListType::GetChildType(map_type), vector<Value>());

	child_list_t<Value> map_struct1;
	map_struct1.push_back(make_pair("key", Value("key1")));
	map_struct1.push_back(make_pair("value", Value("🦆🦆🦆🦆🦆🦆")));
	child_list_t<Value> map_struct2;
	map_struct2.push_back(make_pair("key", Value("key2")));
	map_struct2.push_back(make_pair("value", Value("goose")));

	vector<Value> map_values;
	map_values.push_back(Value::STRUCT(map_struct1));
	map_values.push_back(Value::STRUCT(map_struct2));

	auto max_map_value = Value::MAP(ListType::GetChildType(map_type), map_values);
	result.emplace_back(map_type, "map", std::move(min_map_value), std::move(max_map_value));

	// union
	child_list_t<LogicalType> members = {{"name", LogicalType::VARCHAR}, {"age", LogicalType::SMALLINT}};
	auto union_type = LogicalType::UNION(members);
	const Value &min = Value::UNION(members, 0, Value("Frank"));
	const Value &max = Value::UNION(members, 1, Value::SMALLINT(5));
	result.emplace_back(union_type, "union", min, max);

	// fixed int array
	auto fixed_int_array_type = LogicalType::ARRAY(LogicalType::INTEGER, 3);
	auto fixed_int_min_array_value = Value::ARRAY(LogicalType::INTEGER, {Value(LogicalType::INTEGER), 2, 3});
	auto fixed_int_max_array_value = Value::ARRAY(LogicalType::INTEGER, {4, 5, 6});
	result.emplace_back(fixed_int_array_type, "fixed_int_array", fixed_int_min_array_value, fixed_int_max_array_value);

	// fixed varchar array
	auto fixed_varchar_array_type = LogicalType::ARRAY(LogicalType::VARCHAR, 3);
	auto fixed_varchar_min_array_value =
	    Value::ARRAY(LogicalType::VARCHAR, {Value("a"), Value(LogicalType::VARCHAR), Value("c")});
	auto fixed_varchar_max_array_value = Value::ARRAY(LogicalType::VARCHAR, {Value("d"), Value("e"), Value("f")});
	result.emplace_back(fixed_varchar_array_type, "fixed_varchar_array", fixed_varchar_min_array_value,
	                    fixed_varchar_max_array_value);

	// fixed nested int array
	auto fixed_nested_int_array_type = LogicalType::ARRAY(fixed_int_array_type, 3);
	auto fixed_nested_int_min_array_value = Value::ARRAY(
	    fixed_int_array_type, {fixed_int_min_array_value, Value(fixed_int_array_type), fixed_int_min_array_value});
	auto fixed_nested_int_max_array_value = Value::ARRAY(
	    fixed_int_array_type, {fixed_int_max_array_value, fixed_int_min_array_value, fixed_int_max_array_value});
	result.emplace_back(fixed_nested_int_array_type, "fixed_nested_int_array", fixed_nested_int_min_array_value,
	                    fixed_nested_int_max_array_value);

	// fixed nested varchar array
	auto fixed_nested_varchar_array_type = LogicalType::ARRAY(fixed_varchar_array_type, 3);
	auto fixed_nested_varchar_min_array_value =
	    Value::ARRAY(fixed_varchar_array_type,
	                 {fixed_varchar_min_array_value, Value(fixed_varchar_array_type), fixed_varchar_min_array_value});
	auto fixed_nested_varchar_max_array_value =
	    Value::ARRAY(fixed_varchar_array_type,
	                 {fixed_varchar_max_array_value, fixed_varchar_min_array_value, fixed_varchar_max_array_value});
	result.emplace_back(fixed_nested_varchar_array_type, "fixed_nested_varchar_array",
	                    fixed_nested_varchar_min_array_value, fixed_nested_varchar_max_array_value);

	// fixed array of structs
	auto fixed_struct_array_type = LogicalType::ARRAY(struct_type, 3);
	auto fixed_struct_min_array_value = Value::ARRAY(struct_type, {min_struct_val, max_struct_val, min_struct_val});
	auto fixed_struct_max_array_value = Value::ARRAY(struct_type, {max_struct_val, min_struct_val, max_struct_val});
	result.emplace_back(fixed_struct_array_type, "fixed_struct_array", fixed_struct_min_array_value,
	                    fixed_struct_max_array_value);

	// struct of fixed array
	auto struct_of_fixed_array_type =
	    LogicalType::STRUCT({{"a", fixed_int_array_type}, {"b", fixed_varchar_array_type}});
	auto struct_of_fixed_array_min_value =
	    Value::STRUCT({{"a", fixed_int_min_array_value}, {"b", fixed_varchar_min_array_value}});
	auto struct_of_fixed_array_max_value =
	    Value::STRUCT({{"a", fixed_int_max_array_value}, {"b", fixed_varchar_max_array_value}});
	result.emplace_back(struct_of_fixed_array_type, "struct_of_fixed_array", struct_of_fixed_array_min_value,
	                    struct_of_fixed_array_max_value);

	// fixed array of list of int
	auto fixed_array_of_list_of_int_type = LogicalType::ARRAY(int_list_type, 3);
	auto fixed_array_of_list_of_int_min_value = Value::ARRAY(int_list_type, {empty_int_list, int_list, empty_int_list});
	auto fixed_array_of_list_of_int_max_value = Value::ARRAY(int_list_type, {int_list, empty_int_list, int_list});
	result.emplace_back(fixed_array_of_list_of_int_type, "fixed_array_of_int_list",
	                    fixed_array_of_list_of_int_min_value, fixed_array_of_list_of_int_max_value);

	// list of fixed array of int
	auto list_of_fixed_array_of_int_type = LogicalType::LIST(fixed_int_array_type);
	auto list_of_fixed_array_of_int_min_value = Value::LIST(
	    fixed_int_array_type, {fixed_int_min_array_value, fixed_int_max_array_value, fixed_int_min_array_value});
	auto list_of_fixed_array_of_int_max_value = Value::LIST(
	    fixed_int_array_type, {fixed_int_max_array_value, fixed_int_min_array_value, fixed_int_max_array_value});
	result.emplace_back(list_of_fixed_array_of_int_type, "list_of_fixed_int_array",
	                    list_of_fixed_array_of_int_min_value, list_of_fixed_array_of_int_max_value);

	return result;
}